

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O2

void __thiscall argsman_tests::util_ReadConfigStream::test_method(util_ReadConfigStream *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
  *this_00;
  long lVar1;
  string str_config;
  string arg;
  string arg_00;
  string arg_01;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  right_begin;
  readonly_property<bool> rVar2;
  bool bVar3;
  bool bVar4;
  readonly_property65 rVar5;
  mapped_type *pmVar6;
  size_type sVar7;
  iterator pvVar8;
  iterator pvVar9;
  long lVar10;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string msg_52;
  const_string msg_53;
  const_string msg_54;
  const_string msg_55;
  const_string msg_56;
  const_string msg_57;
  const_string msg_58;
  const_string msg_59;
  const_string msg_60;
  const_string msg_61;
  const_string msg_62;
  const_string msg_63;
  const_string msg_64;
  const_string msg_65;
  const_string msg_66;
  const_string msg_67;
  const_string msg_68;
  const_string msg_69;
  const_string msg_70;
  const_string msg_71;
  const_string msg_72;
  const_string msg_73;
  const_string msg_74;
  const_string msg_75;
  const_string msg_76;
  const_string msg_77;
  const_string msg_78;
  const_string msg_79;
  const_string msg_80;
  const_string msg_81;
  const_string msg_82;
  const_string msg_83;
  const_string msg_84;
  const_string msg_85;
  const_string msg_86;
  const_string msg_87;
  const_string msg_88;
  const_string msg_89;
  const_string msg_90;
  const_string msg_91;
  const_string msg_92;
  const_string msg_93;
  const_string msg_94;
  const_string msg_95;
  const_string msg_96;
  const_string msg_97;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string file_48;
  const_string file_49;
  const_string file_50;
  const_string file_51;
  const_string file_52;
  const_string file_53;
  const_string file_54;
  const_string file_55;
  const_string file_56;
  const_string file_57;
  const_string file_58;
  const_string file_59;
  const_string file_60;
  const_string file_61;
  const_string file_62;
  const_string file_63;
  const_string file_64;
  const_string file_65;
  const_string file_66;
  const_string file_67;
  const_string file_68;
  const_string file_69;
  const_string file_70;
  const_string file_71;
  const_string file_72;
  const_string file_73;
  const_string file_74;
  const_string file_75;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  const_string file_76;
  const_string file_77;
  const_string file_78;
  const_string file_79;
  const_string file_80;
  const_string file_81;
  const_string file_82;
  const_string file_83;
  const_string file_84;
  const_string file_85;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  const_string file_86;
  const_string file_87;
  const_string file_88;
  const_string file_89;
  const_string file_90;
  const_string file_91;
  const_string file_92;
  const_string file_93;
  const_string file_94;
  const_string file_95;
  const_string file_96;
  const_string file_97;
  undefined4 in_stack_ffffffffffffe588;
  undefined4 uVar11;
  undefined4 in_stack_ffffffffffffe58c;
  undefined4 uVar12;
  check_type cVar16;
  char *pcVar13;
  undefined8 in_stack_ffffffffffffe598;
  char *pcVar14;
  undefined8 in_stack_ffffffffffffe5a0;
  char *pcVar15;
  char *local_1a40;
  char *local_1a38;
  undefined1 *local_1a30;
  undefined1 *local_1a28;
  char *local_1a20;
  char *local_1a18;
  char *local_1a10;
  char *local_1a08;
  undefined1 *local_1a00;
  undefined1 *local_19f8;
  char *local_19f0;
  char *local_19e8;
  char *local_19e0;
  char *local_19d8;
  undefined1 *local_19d0;
  undefined1 *local_19c8;
  char *local_19c0;
  char *local_19b8;
  char *local_19b0;
  char *local_19a8;
  undefined1 *local_19a0;
  undefined1 *local_1998;
  char *local_1990;
  char *local_1988;
  char *local_1980;
  char *local_1978;
  undefined1 *local_1970;
  undefined1 *local_1968;
  char *local_1960;
  char *local_1958;
  char *local_1950;
  char *local_1948;
  undefined1 *local_1940;
  undefined1 *local_1938;
  char *local_1930;
  char *local_1928;
  char *local_1920;
  char *local_1918;
  undefined1 *local_1910;
  undefined1 *local_1908;
  char *local_1900;
  char *local_18f8;
  char *local_18f0;
  char *local_18e8;
  undefined1 *local_18e0;
  undefined1 *local_18d8;
  char *local_18d0;
  char *local_18c8;
  char *local_18c0;
  char *local_18b8;
  undefined1 *local_18b0;
  undefined1 *local_18a8;
  char *local_18a0;
  char *local_1898;
  char *local_1890;
  char *local_1888;
  undefined1 *local_1880;
  undefined1 *local_1878;
  char *local_1870;
  char *local_1868;
  char *local_1860;
  char *local_1858;
  char *local_1850;
  char *local_1848;
  allocator<char> local_183a;
  allocator<char> local_1839;
  assertion_result local_1838;
  undefined1 *local_1820;
  undefined1 *local_1818;
  char *local_1810;
  char *local_1808;
  char *local_1800;
  char *local_17f8;
  undefined1 *local_17f0;
  undefined1 *local_17e8;
  char *local_17e0;
  char *local_17d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_17d0;
  char *local_17b8;
  char *local_17b0;
  undefined1 *local_17a8;
  undefined1 *local_17a0;
  char *local_1798;
  char *local_1790;
  char *local_1788;
  char *local_1780;
  undefined1 *local_1778;
  undefined1 *local_1770;
  char *local_1768;
  char *local_1760;
  char *local_1758;
  char *local_1750;
  undefined1 *local_1748;
  undefined1 *local_1740;
  char *local_1738;
  char *local_1730;
  char *local_1728;
  char *local_1720;
  undefined1 *local_1718;
  undefined1 *local_1710;
  char *local_1708;
  char *local_1700;
  char *local_16f8;
  char *local_16f0;
  undefined1 *local_16e8;
  undefined1 *local_16e0;
  char *local_16d8;
  char *local_16d0;
  char *local_16c8;
  char *local_16c0;
  undefined1 *local_16b8;
  undefined1 *local_16b0;
  char *local_16a8;
  char *local_16a0;
  char *local_1698;
  char *local_1690;
  undefined1 *local_1688;
  undefined1 *local_1680;
  char *local_1678;
  char *local_1670;
  char *local_1668;
  char *local_1660;
  undefined1 *local_1658;
  undefined1 *local_1650;
  char *local_1648;
  char *local_1640;
  char *local_1638;
  char *local_1630;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sec2_ccc_expected;
  undefined1 *local_1610;
  undefined1 *local_1608;
  char *local_1600;
  char *local_15f8;
  char *local_15f0;
  char *local_15e8;
  undefined1 *local_15e0;
  undefined1 *local_15d8;
  char *local_15d0;
  char *local_15c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_15c0;
  char *local_15a8;
  char *local_15a0;
  undefined1 *local_1598;
  undefined1 *local_1590;
  char *local_1588;
  char *local_1580;
  char *local_1578;
  char *local_1570;
  undefined1 *local_1568;
  undefined1 *local_1560;
  char *local_1558;
  char *local_1550;
  char *local_1548;
  char *local_1540;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sec1_ccc_expected;
  undefined1 *local_1520;
  undefined1 *local_1518;
  char *local_1510;
  char *local_1508;
  char *local_1500;
  char *local_14f8;
  undefined1 *local_14f0;
  undefined1 *local_14e8;
  char *local_14e0;
  char *local_14d8;
  char *local_14d0;
  char *local_14c8;
  undefined1 *local_14c0;
  undefined1 *local_14b8;
  char *local_14b0;
  char *local_14a8;
  char *local_14a0;
  char *local_1498;
  undefined1 *local_1490;
  undefined1 *local_1488;
  char *local_1480;
  char *local_1478;
  char *local_1470;
  char *local_1468;
  undefined1 *local_1460;
  undefined1 *local_1458;
  char *local_1450;
  char *local_1448;
  char *local_1440;
  char *local_1438;
  undefined1 *local_1430;
  undefined1 *local_1428;
  char *local_1420;
  char *local_1418;
  char *local_1410;
  char *local_1408;
  undefined1 *local_1400;
  undefined1 *local_13f8;
  char *local_13f0;
  char *local_13e8;
  char *local_13e0;
  char *local_13d8;
  undefined1 *local_13d0;
  undefined1 *local_13c8;
  char *local_13c0;
  char *local_13b8;
  char *local_13b0;
  char *local_13a8;
  undefined1 *local_13a0;
  undefined1 *local_1398;
  char *local_1390;
  char *local_1388;
  char *local_1380;
  char *local_1378;
  undefined1 *local_1370;
  undefined1 *local_1368;
  char *local_1360;
  char *local_1358;
  char *local_1350;
  char *local_1348;
  undefined1 *local_1340;
  undefined1 *local_1338;
  char *local_1330;
  char *local_1328;
  char *local_1320;
  char *local_1318;
  undefined1 *local_1310;
  undefined1 *local_1308;
  char *local_1300;
  char *local_12f8;
  char *local_12f0;
  char *local_12e8;
  undefined1 *local_12e0;
  undefined1 *local_12d8;
  char *local_12d0;
  char *local_12c8;
  char *local_12c0;
  char *local_12b8;
  undefined1 *local_12b0;
  undefined1 *local_12a8;
  char *local_12a0;
  char *local_1298;
  char *local_1290;
  char *local_1288;
  undefined1 *local_1280;
  undefined1 *local_1278;
  char *local_1270;
  char *local_1268;
  char *local_1260;
  char *local_1258;
  undefined1 *local_1250;
  undefined1 *local_1248;
  char *local_1240;
  char *local_1238;
  char *local_1230;
  char *local_1228;
  undefined1 *local_1220;
  undefined1 *local_1218;
  char *local_1210;
  char *local_1208;
  char *local_1200;
  char *local_11f8;
  undefined1 *local_11f0;
  undefined1 *local_11e8;
  char *local_11e0;
  char *local_11d8;
  char *local_11d0;
  char *local_11c8;
  allocator<char> local_11b9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_11b8;
  undefined1 *local_11a0;
  undefined1 *local_1198;
  char *local_1190;
  char *local_1188;
  char *local_1180;
  char *local_1178;
  undefined1 *local_1170;
  undefined1 *local_1168;
  char *local_1160;
  char *local_1158;
  char *local_1150;
  char *local_1148;
  undefined1 *local_1140;
  undefined1 *local_1138;
  char *local_1130;
  char *local_1128;
  char *local_1120;
  char *local_1118;
  undefined1 *local_1110;
  undefined1 *local_1108;
  char *local_1100;
  char *local_10f8;
  char *local_10f0;
  char *local_10e8;
  allocator<char> local_10d9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_10d8;
  undefined1 *local_10c0;
  undefined1 *local_10b8;
  char *local_10b0;
  char *local_10a8;
  char *local_10a0;
  char *local_1098;
  undefined1 *local_1090;
  undefined1 *local_1088;
  char *local_1080;
  char *local_1078;
  char *local_1070;
  char *local_1068;
  undefined1 *local_1060;
  undefined1 *local_1058;
  char *local_1050;
  char *local_1048;
  char *local_1040;
  char *local_1038;
  undefined8 local_1030;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1028;
  allocator<char> local_1009;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1008;
  undefined1 *local_ff0;
  undefined1 *local_fe8;
  char *local_fe0;
  char *local_fd8;
  char *local_fd0;
  char *local_fc8;
  allocator<char> local_fb9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_fb8;
  undefined1 *local_fa0;
  undefined1 *local_f98;
  char *local_f90;
  char *local_f88;
  char *local_f80;
  char *local_f78;
  allocator<char> local_f69;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f68;
  undefined1 *local_f50;
  undefined1 *local_f48;
  char *local_f40;
  char *local_f38;
  char *local_f30;
  char *local_f28;
  undefined1 *local_f20;
  undefined1 *local_f18;
  char *local_f10;
  char *local_f08;
  char *local_f00;
  char *local_ef8;
  undefined1 *local_ef0;
  undefined1 *local_ee8;
  char *local_ee0;
  char *local_ed8;
  char *local_ed0;
  char *local_ec8;
  undefined1 *local_ec0;
  undefined1 *local_eb8;
  char *local_eb0;
  char *local_ea8;
  char *local_ea0;
  char *local_e98;
  undefined1 *local_e90;
  undefined1 *local_e88;
  char *local_e80;
  char *local_e78;
  char *local_e70;
  char *local_e68;
  undefined1 *local_e60;
  undefined1 *local_e58;
  char *local_e50;
  char *local_e48;
  char *local_e40;
  char *local_e38;
  undefined1 *local_e30;
  undefined1 *local_e28;
  char *local_e20;
  char *local_e18;
  char *local_e10;
  char *local_e08;
  undefined1 *local_e00;
  undefined1 *local_df8;
  char *local_df0;
  char *local_de8;
  char *local_de0;
  char *local_dd8;
  undefined1 *local_dd0;
  undefined1 *local_dc8;
  char *local_dc0;
  char *local_db8;
  char *local_db0;
  char *local_da8;
  undefined1 *local_da0;
  undefined1 *local_d98;
  char *local_d90;
  char *local_d88;
  char *local_d80;
  char *local_d78;
  undefined1 *local_d70;
  undefined1 *local_d68;
  char *local_d60;
  char *local_d58;
  char *local_d50;
  char *local_d48;
  undefined1 *local_d40;
  undefined1 *local_d38;
  char *local_d30;
  char *local_d28;
  char *local_d20;
  char *local_d18;
  undefined1 *local_d10;
  undefined1 *local_d08;
  char *local_d00;
  char *local_cf8;
  char *local_cf0;
  char *local_ce8;
  undefined1 *local_ce0;
  undefined1 *local_cd8;
  char *local_cd0;
  char *local_cc8;
  char *local_cc0;
  char *local_cb8;
  undefined1 *local_cb0;
  undefined1 *local_ca8;
  char *local_ca0;
  char *local_c98;
  char *local_c90;
  char *local_c88;
  undefined1 *local_c80;
  undefined1 *local_c78;
  char *local_c70;
  char *local_c68;
  char *local_c60;
  char *local_c58;
  undefined1 *local_c50;
  undefined1 *local_c48;
  char *local_c40;
  char *local_c38;
  char *local_c30;
  char *local_c28;
  undefined1 *local_c20;
  undefined1 *local_c18;
  char *local_c10;
  char *local_c08;
  char *local_c00;
  char *local_bf8;
  undefined1 *local_bf0;
  undefined1 *local_be8;
  char *local_be0;
  char *local_bd8;
  char *local_bd0;
  char *local_bc8;
  undefined1 *local_bc0;
  undefined1 *local_bb8;
  char *local_bb0;
  char *local_ba8;
  char *local_ba0;
  char *local_b98;
  undefined1 *local_b90;
  undefined1 *local_b88;
  char *local_b80;
  char *local_b78;
  char *local_b70;
  char *local_b68;
  undefined1 *local_b60;
  undefined1 *local_b58;
  char *local_b50;
  char *local_b48;
  char *local_b40;
  char *local_b38;
  undefined1 *local_b30;
  undefined1 *local_b28;
  char *local_b20;
  char *local_b18;
  char *local_b10;
  char *local_b08;
  undefined1 *local_b00;
  undefined1 *local_af8;
  char *local_af0;
  char *local_ae8;
  char *local_ae0;
  char *local_ad8;
  undefined1 *local_ad0;
  undefined1 *local_ac8;
  char *local_ac0;
  char *local_ab8;
  char *local_ab0;
  char *local_aa8;
  undefined1 *local_aa0;
  undefined1 *local_a98;
  char *local_a90;
  char *local_a88;
  char *local_a80;
  char *local_a78;
  undefined1 *local_a70;
  undefined1 *local_a68;
  char *local_a60;
  char *local_a58;
  char *local_a50;
  char *local_a48;
  undefined1 *local_a40;
  undefined1 *local_a38;
  char *local_a30;
  char *local_a28;
  char *local_a20;
  char *local_a18;
  undefined1 *local_a10;
  undefined1 *local_a08;
  char *local_a00;
  char *local_9f8;
  char *local_9f0;
  char *local_9e8;
  undefined1 *local_9e0;
  undefined1 *local_9d8;
  char *local_9d0;
  char *local_9c8;
  char *local_9c0;
  char *local_9b8;
  undefined1 *local_9b0;
  undefined1 *local_9a8;
  char *local_9a0;
  char *local_998;
  char *local_990;
  char *local_988;
  undefined1 *local_980;
  undefined1 *local_978;
  char *local_970;
  char *local_968;
  char *local_960;
  char *local_958;
  undefined1 *local_950;
  undefined1 *local_948;
  char *local_940;
  char *local_938;
  char *local_930;
  char *local_928;
  undefined1 *local_920;
  undefined1 *local_918;
  char *local_910;
  char *local_908;
  char *local_900;
  char *local_8f8;
  undefined1 *local_8f0;
  undefined1 *local_8e8;
  char *local_8e0;
  char *local_8d8;
  char *local_8d0;
  char *local_8c8;
  undefined1 *local_8c0;
  undefined1 *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  char *local_898;
  undefined1 *local_890;
  undefined1 *local_888;
  char *local_880;
  char *local_878;
  char *local_870;
  char *local_868;
  undefined1 *local_860;
  undefined1 *local_858;
  char *local_850;
  char *local_848;
  char *local_840;
  char *local_838;
  undefined1 *local_830;
  undefined1 *local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  undefined1 *local_800;
  undefined1 *local_7f8;
  char *local_7f0;
  char *local_7e8;
  char *local_7e0;
  char *local_7d8;
  undefined1 *local_7d0;
  undefined1 *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  char *local_7a8;
  undefined1 *local_7a0;
  undefined1 *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  char *local_778;
  undefined1 *local_770;
  undefined1 *local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  char *local_748;
  undefined1 *local_740;
  undefined1 *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  undefined1 *local_710;
  undefined1 *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  undefined1 *local_6e0;
  undefined1 *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  undefined1 *local_6b0;
  undefined1 *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  undefined1 *local_680;
  undefined1 *local_678;
  char *local_670;
  char *local_668;
  pair<const_char_*,_ArgsManager::Flags> local_660;
  pair<const_char_*,_ArgsManager::Flags> local_650;
  pair<const_char_*,_ArgsManager::Flags> local_640;
  pair<const_char_*,_ArgsManager::Flags> local_630;
  pair<const_char_*,_ArgsManager::Flags> local_620;
  pair<const_char_*,_ArgsManager::Flags> local_610;
  pair<const_char_*,_ArgsManager::Flags> local_600;
  pair<const_char_*,_ArgsManager::Flags> local_5f0;
  pair<const_char_*,_ArgsManager::Flags> local_5e0;
  pair<const_char_*,_ArgsManager::Flags> local_5d0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock16;
  string local_5b0 [32];
  string local_590 [32];
  string local_570 [32];
  undefined1 local_550 [32];
  string local_530;
  undefined1 local_510 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_500;
  undefined1 local_4f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_4e0;
  undefined1 local_4d0 [32];
  string local_4b0;
  undefined1 local_490 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_480;
  undefined1 local_470 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_460;
  undefined1 local_450 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_440;
  string local_430 [32];
  undefined1 local_410 [16];
  undefined1 *local_400;
  undefined8 local_3f8;
  string local_3f0 [8];
  undefined1 local_3e8 [40];
  undefined1 local_3c0 [40];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_398;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_370;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_348;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_320;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_2f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_2d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_2a8;
  TestArgsManager test_args;
  
  local_1030 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TestArgsManager::TestArgsManager(&test_args);
  pvVar8 = (iterator)0x1b8;
  pvVar9 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock16,(AnnotatedMixin<std::recursive_mutex> *)&test_args,"test_args.cs_args"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
             ,0x1b8,false);
  local_5d0.first = "-a";
  local_660.second = ALLOW_ANY;
  local_5e0.first = "-b";
  local_5f0.first = "-ccc";
  local_600.first = "-d";
  local_610.first = "-e";
  local_620.first = "-fff";
  local_630.first = "-ggg";
  local_640.first = "-h";
  local_650.first = "-i";
  local_660.first = "-iii";
  local_650.second = local_660.second;
  local_640.second = local_660.second;
  local_630.second = local_660.second;
  local_620.second = local_660.second;
  local_610.second = local_660.second;
  local_600.second = local_660.second;
  local_5f0.second = local_660.second;
  local_5e0.second = local_660.second;
  local_5d0.second = local_660.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)local_410,&local_5d0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)local_3e8,&local_5e0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)local_3c0,&local_5f0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>(&local_398,&local_600);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>(&local_370,&local_610);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>(&local_348,&local_620);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>(&local_320,&local_630);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>(&local_2f8,&local_640);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>(&local_2d0,&local_650);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>(&local_2a8,&local_660);
  __l._M_len = 10;
  __l._M_array = (iterator)local_410;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)local_450,__l,(allocator_type *)local_470);
  TestArgsManager::SetupArgs
            (&test_args,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)local_450);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)local_450);
  lVar10 = 0x168;
  do {
    std::__cxx11::string::~string((string *)(local_410 + lVar10));
    lVar10 = lVar10 + -0x28;
  } while (lVar10 != -0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_430,
             "a=\nb=1\nccc=argument\nccc=multiple\nd=e\nnofff=1\nnoggg=0\nh=1\nnoh=1\nnoi=1\ni=1\nsec1.ccc=extend1\n\n[sec1]\nccc=extend2\nd=eee\nh=1\n[sec2]\nccc=extend3\niii=2\n"
             ,(allocator<char> *)local_410);
  str_config._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe58c;
  str_config._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe588;
  str_config._M_string_length = (size_type)_cVar16;
  str_config.field_2._M_allocated_capacity = in_stack_ffffffffffffe598;
  str_config.field_2._8_8_ = in_stack_ffffffffffffe5a0;
  TestArgsManager::ReadConfigString(&test_args,str_config);
  std::__cxx11::string::~string(local_430);
  local_670 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_668 = "";
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  local_678 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = pvVar9;
  msg.m_begin = pvVar8;
  file.m_end = (iterator)0x1c9;
  file.m_begin = (iterator)&local_670;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_680,msg);
  local_450._8_8_ = (element_type *)0x0;
  aStack_440._M_allocated_capacity = 0;
  local_470._0_8_ = "test_args.m_settings.command_line_options.empty()";
  local_470._8_8_ = "";
  local_410[8] = false;
  local_410._0_8_ = &PTR__lazy_ostream_0113a070;
  local_400 = boost::unit_test::lazy_ostream::inst;
  local_690 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_688 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_3f8 = (allocator_type *)local_470;
  local_450[0] = (class_property<bool>)
                 (class_property<bool>)
                 (test_args.super_ArgsManager.m_settings.command_line_options._M_t._M_impl.
                  super__Rb_tree_header._M_node_count == 0);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_450,(lazy_ostream *)local_410,1,0,WARN,_cVar16,
             (size_t)&local_690,0x1c9);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_440._M_allocated_capacity);
  local_6a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_698 = "";
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar9;
  msg_00.m_begin = pvVar8;
  file_00.m_end = (iterator)0x1ca;
  file_00.m_begin = (iterator)&local_6a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_6b0,
             msg_00);
  local_450[0] = (class_property<bool>)
                 (class_property<bool>)
                 (test_args.super_ArgsManager.m_settings.ro_config._M_t._M_impl.
                  super__Rb_tree_header._M_node_count == 3);
  local_450._8_8_ = (element_type *)0x0;
  aStack_440._M_allocated_capacity = 0;
  local_470._0_8_ = "test_args.m_settings.ro_config.size() == 3";
  local_470._8_8_ = "";
  local_410[8] = false;
  local_410._0_8_ = &PTR__lazy_ostream_0113a070;
  local_400 = boost::unit_test::lazy_ostream::inst;
  local_6c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_6b8 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_3f8 = (allocator_type *)local_470;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_450,(lazy_ostream *)local_410,1,0,WARN,_cVar16,
             (size_t)&local_6c0,0x1ca);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_440._M_allocated_capacity);
  local_6d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_6c8 = "";
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar9;
  msg_01.m_begin = pvVar8;
  file_01.m_end = (iterator)0x1cb;
  file_01.m_begin = (iterator)&local_6d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_6e0,
             msg_01);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"",(allocator<char> *)&local_4b0);
  this_00 = &test_args.super_ArgsManager.m_settings.ro_config;
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
           ::operator[](this_00,(key_type *)local_410);
  local_470._8_8_ = (element_type *)0x0;
  aStack_460._M_allocated_capacity = 0;
  local_490._0_8_ = "test_args.m_settings.ro_config[\"\"].size() == 8";
  local_490._8_8_ = "";
  local_450._8_8_ = local_450._8_8_ & 0xffffffffffffff00;
  local_450._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_440._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_6f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_6e8 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_440._8_8_ = local_490;
  local_470[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 8);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_470,(lazy_ostream *)local_450,1,0,WARN,_cVar16,
             (size_t)&local_6f0,0x1cb);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_460._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_410);
  local_700 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_6f8 = "";
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  local_708 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar9;
  msg_02.m_begin = pvVar8;
  file_02.m_end = (iterator)0x1cc;
  file_02.m_begin = (iterator)&local_700;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_710,
             msg_02);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"sec1",(allocator<char> *)&local_4b0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
           ::operator[](this_00,(key_type *)local_410);
  local_470[0] = (class_property<bool>)
                 ((pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 3);
  local_470._8_8_ = (element_type *)0x0;
  aStack_460._M_allocated_capacity = 0;
  local_490._0_8_ = "test_args.m_settings.ro_config[\"sec1\"].size() == 3";
  local_490._8_8_ = "";
  local_450._8_8_ = local_450._8_8_ & 0xffffffffffffff00;
  local_450._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_440._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_720 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_718 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_440._8_8_ = local_490;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_470,(lazy_ostream *)local_450,1,0,WARN,_cVar16,
             (size_t)&local_720,0x1cc);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_460._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_410);
  local_730 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_728 = "";
  local_740 = &boost::unit_test::basic_cstring<char_const>::null;
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar9;
  msg_03.m_begin = pvVar8;
  file_03.m_end = (iterator)0x1cd;
  file_03.m_begin = (iterator)&local_730;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_740,
             msg_03);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"sec2",(allocator<char> *)&local_4b0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
           ::operator[](this_00,(key_type *)local_410);
  local_470[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 2);
  local_470._8_8_ = (element_type *)0x0;
  aStack_460._M_allocated_capacity = 0;
  local_490._0_8_ = "test_args.m_settings.ro_config[\"sec2\"].size() == 2";
  local_490._8_8_ = "";
  local_450._8_8_ = local_450._8_8_ & 0xffffffffffffff00;
  local_450._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_440._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_750 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_748 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_440._8_8_ = local_490;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_470,(lazy_ostream *)local_450,1,0,WARN,_cVar16,
             (size_t)&local_750,0x1cd);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_460._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_410);
  local_760 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_758 = "";
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  local_768 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar9;
  msg_04.m_begin = pvVar8;
  file_04.m_end = (iterator)0x1cf;
  file_04.m_begin = (iterator)&local_760;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_770,
             msg_04);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"",(allocator<char> *)local_4d0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
           ::operator[](this_00,(key_type *)local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_450,"a",(allocator<char> *)local_4f0);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
          ::count(pmVar6,(key_type *)local_450);
  local_490._8_8_ = (element_type *)0x0;
  aStack_480._M_allocated_capacity = 0;
  local_4b0._M_dataplus._M_p = "test_args.m_settings.ro_config[\"\"].count(\"a\")";
  local_4b0._M_string_length = 0xb531e0;
  local_470._8_8_ = local_470._8_8_ & 0xffffffffffffff00;
  local_470._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_460._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_780 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_778 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_460._8_8_ = &local_4b0;
  local_490[0] = (class_property<bool>)(class_property<bool>)(sVar7 != 0);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_490,(lazy_ostream *)local_470,1,0,WARN,_cVar16,
             (size_t)&local_780,0x1cf);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_480._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_450);
  std::__cxx11::string::~string((string *)local_410);
  local_790 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_788 = "";
  local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_798 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar9;
  msg_05.m_begin = pvVar8;
  file_05.m_end = (iterator)0x1d0;
  file_05.m_begin = (iterator)&local_790;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_7a0,
             msg_05);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"",(allocator<char> *)local_4d0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
           ::operator[](this_00,(key_type *)local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_450,"b",(allocator<char> *)local_4f0);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
          ::count(pmVar6,(key_type *)local_450);
  local_490[0] = (class_property<bool>)(sVar7 != 0);
  local_490._8_8_ = (element_type *)0x0;
  aStack_480._M_allocated_capacity = 0;
  local_4b0._M_dataplus._M_p = "test_args.m_settings.ro_config[\"\"].count(\"b\")";
  local_4b0._M_string_length = 0xb5320e;
  local_470._8_8_ = local_470._8_8_ & 0xffffffffffffff00;
  local_470._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_460._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_7b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_7a8 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_460._8_8_ = &local_4b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_490,(lazy_ostream *)local_470,1,0,WARN,_cVar16,
             (size_t)&local_7b0,0x1d0);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_480._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_450);
  std::__cxx11::string::~string((string *)local_410);
  local_7c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_7b8 = "";
  local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar9;
  msg_06.m_begin = pvVar8;
  file_06.m_end = (iterator)0x1d1;
  file_06.m_begin = (iterator)&local_7c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_7d0,
             msg_06);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"",(allocator<char> *)local_4d0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
           ::operator[](this_00,(key_type *)local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_450,"ccc",(allocator<char> *)local_4f0);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
          ::count(pmVar6,(key_type *)local_450);
  local_490[0] = (class_property<bool>)(sVar7 != 0);
  local_490._8_8_ = (element_type *)0x0;
  aStack_480._M_allocated_capacity = 0;
  local_4b0._M_dataplus._M_p = "test_args.m_settings.ro_config[\"\"].count(\"ccc\")";
  local_4b0._M_string_length = 0xb5323e;
  local_470._8_8_ = local_470._8_8_ & 0xffffffffffffff00;
  local_470._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_460._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_7e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_7d8 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_460._8_8_ = &local_4b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_490,(lazy_ostream *)local_470,1,0,WARN,_cVar16,
             (size_t)&local_7e0,0x1d1);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_480._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_450);
  std::__cxx11::string::~string((string *)local_410);
  local_7f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_7e8 = "";
  local_800 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar9;
  msg_07.m_begin = pvVar8;
  file_07.m_end = (iterator)0x1d2;
  file_07.m_begin = (iterator)&local_7f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_800,
             msg_07);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"",(allocator<char> *)local_4d0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
           ::operator[](this_00,(key_type *)local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_450,"d",(allocator<char> *)local_4f0);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
          ::count(pmVar6,(key_type *)local_450);
  local_490[0] = (class_property<bool>)(sVar7 != 0);
  local_490._8_8_ = (element_type *)0x0;
  aStack_480._M_allocated_capacity = 0;
  local_4b0._M_dataplus._M_p = "test_args.m_settings.ro_config[\"\"].count(\"d\")";
  local_4b0._M_string_length = 0xb5326c;
  local_470._8_8_ = local_470._8_8_ & 0xffffffffffffff00;
  local_470._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_460._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_810 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_808 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_460._8_8_ = &local_4b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_490,(lazy_ostream *)local_470,1,0,WARN,_cVar16,
             (size_t)&local_810,0x1d2);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_480._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_450);
  std::__cxx11::string::~string((string *)local_410);
  local_820 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_818 = "";
  local_830 = &boost::unit_test::basic_cstring<char_const>::null;
  local_828 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar9;
  msg_08.m_begin = pvVar8;
  file_08.m_end = (iterator)0x1d3;
  file_08.m_begin = (iterator)&local_820;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_830,
             msg_08);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"",(allocator<char> *)local_4d0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
           ::operator[](this_00,(key_type *)local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_450,"fff",(allocator<char> *)local_4f0);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
          ::count(pmVar6,(key_type *)local_450);
  local_490[0] = (class_property<bool>)(sVar7 != 0);
  local_490._8_8_ = (element_type *)0x0;
  aStack_480._M_allocated_capacity = 0;
  local_4b0._M_dataplus._M_p = "test_args.m_settings.ro_config[\"\"].count(\"fff\")";
  local_4b0._M_string_length = 0xb5329c;
  local_470._8_8_ = local_470._8_8_ & 0xffffffffffffff00;
  local_470._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_460._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_840 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_838 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_460._8_8_ = &local_4b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_490,(lazy_ostream *)local_470,1,0,WARN,_cVar16,
             (size_t)&local_840,0x1d3);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_480._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_450);
  std::__cxx11::string::~string((string *)local_410);
  local_850 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_848 = "";
  local_860 = &boost::unit_test::basic_cstring<char_const>::null;
  local_858 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar9;
  msg_09.m_begin = pvVar8;
  file_09.m_end = (iterator)0x1d4;
  file_09.m_begin = (iterator)&local_850;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_860,
             msg_09);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"",(allocator<char> *)local_4d0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
           ::operator[](this_00,(key_type *)local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_450,"ggg",(allocator<char> *)local_4f0);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
          ::count(pmVar6,(key_type *)local_450);
  local_490[0] = (class_property<bool>)(sVar7 != 0);
  local_490._8_8_ = (element_type *)0x0;
  aStack_480._M_allocated_capacity = 0;
  local_4b0._M_dataplus._M_p = "test_args.m_settings.ro_config[\"\"].count(\"ggg\")";
  local_4b0._M_string_length = 0xb532cc;
  local_470._8_8_ = local_470._8_8_ & 0xffffffffffffff00;
  local_470._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_460._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_870 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_868 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_460._8_8_ = &local_4b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_490,(lazy_ostream *)local_470,1,0,WARN,_cVar16,
             (size_t)&local_870,0x1d4);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_480._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_450);
  std::__cxx11::string::~string((string *)local_410);
  local_880 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_878 = "";
  local_890 = &boost::unit_test::basic_cstring<char_const>::null;
  local_888 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar9;
  msg_10.m_begin = pvVar8;
  file_10.m_end = (iterator)0x1d5;
  file_10.m_begin = (iterator)&local_880;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_890,
             msg_10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"",(allocator<char> *)local_4d0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
           ::operator[](this_00,(key_type *)local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_450,"h",(allocator<char> *)local_4f0);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
          ::count(pmVar6,(key_type *)local_450);
  local_490[0] = (class_property<bool>)(sVar7 != 0);
  local_490._8_8_ = (element_type *)0x0;
  aStack_480._M_allocated_capacity = 0;
  local_4b0._M_dataplus._M_p = "test_args.m_settings.ro_config[\"\"].count(\"h\")";
  local_4b0._M_string_length = 0xb532fa;
  local_470._8_8_ = local_470._8_8_ & 0xffffffffffffff00;
  local_470._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_460._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_8a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_898 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_460._8_8_ = &local_4b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_490,(lazy_ostream *)local_470,1,0,WARN,_cVar16,
             (size_t)&local_8a0,0x1d5);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_480._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_450);
  std::__cxx11::string::~string((string *)local_410);
  local_8b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_8a8 = "";
  local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = pvVar9;
  msg_11.m_begin = pvVar8;
  file_11.m_end = (iterator)0x1d6;
  file_11.m_begin = (iterator)&local_8b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_8c0,
             msg_11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"",(allocator<char> *)local_4d0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
           ::operator[](this_00,(key_type *)local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_450,"i",(allocator<char> *)local_4f0);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
          ::count(pmVar6,(key_type *)local_450);
  local_490[0] = (class_property<bool>)(sVar7 != 0);
  local_490._8_8_ = (element_type *)0x0;
  aStack_480._M_allocated_capacity = 0;
  local_4b0._M_dataplus._M_p = "test_args.m_settings.ro_config[\"\"].count(\"i\")";
  local_4b0._M_string_length = 0xb53328;
  local_470._8_8_ = local_470._8_8_ & 0xffffffffffffff00;
  local_470._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_460._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_8d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_8c8 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_460._8_8_ = &local_4b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_490,(lazy_ostream *)local_470,1,0,WARN,_cVar16,
             (size_t)&local_8d0,0x1d6);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_480._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_450);
  std::__cxx11::string::~string((string *)local_410);
  local_8e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_8d8 = "";
  local_8f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = pvVar9;
  msg_12.m_begin = pvVar8;
  file_12.m_end = (iterator)0x1d7;
  file_12.m_begin = (iterator)&local_8e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_8f0,
             msg_12);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"sec1",(allocator<char> *)local_4d0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
           ::operator[](this_00,(key_type *)local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_450,"ccc",(allocator<char> *)local_4f0);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
          ::count(pmVar6,(key_type *)local_450);
  local_490[0] = (class_property<bool>)(sVar7 != 0);
  local_490._8_8_ = (element_type *)0x0;
  aStack_480._M_allocated_capacity = 0;
  local_4b0._M_dataplus._M_p = "test_args.m_settings.ro_config[\"sec1\"].count(\"ccc\")";
  local_4b0._M_string_length = 0xb5335c;
  local_470._8_8_ = local_470._8_8_ & 0xffffffffffffff00;
  local_470._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_460._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_900 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_8f8 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_460._8_8_ = &local_4b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_490,(lazy_ostream *)local_470,1,0,WARN,_cVar16,
             (size_t)&local_900,0x1d7);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_480._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_450);
  std::__cxx11::string::~string((string *)local_410);
  local_910 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_908 = "";
  local_920 = &boost::unit_test::basic_cstring<char_const>::null;
  local_918 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = pvVar9;
  msg_13.m_begin = pvVar8;
  file_13.m_end = (iterator)0x1d8;
  file_13.m_begin = (iterator)&local_910;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_920,
             msg_13);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"sec1",(allocator<char> *)local_4d0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
           ::operator[](this_00,(key_type *)local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_450,"h",(allocator<char> *)local_4f0);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
          ::count(pmVar6,(key_type *)local_450);
  local_490[0] = (class_property<bool>)(sVar7 != 0);
  local_490._8_8_ = (element_type *)0x0;
  aStack_480._M_allocated_capacity = 0;
  local_4b0._M_dataplus._M_p = "test_args.m_settings.ro_config[\"sec1\"].count(\"h\")";
  local_4b0._M_string_length = 0xb5338e;
  local_470._8_8_ = local_470._8_8_ & 0xffffffffffffff00;
  local_470._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_460._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_930 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_928 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_460._8_8_ = &local_4b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_490,(lazy_ostream *)local_470,1,0,WARN,_cVar16,
             (size_t)&local_930,0x1d8);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_480._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_450);
  std::__cxx11::string::~string((string *)local_410);
  local_940 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_938 = "";
  local_950 = &boost::unit_test::basic_cstring<char_const>::null;
  local_948 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = pvVar9;
  msg_14.m_begin = pvVar8;
  file_14.m_end = (iterator)0x1d9;
  file_14.m_begin = (iterator)&local_940;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_950,
             msg_14);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"sec2",(allocator<char> *)local_4d0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
           ::operator[](this_00,(key_type *)local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_450,"ccc",(allocator<char> *)local_4f0);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
          ::count(pmVar6,(key_type *)local_450);
  local_490[0] = (class_property<bool>)(sVar7 != 0);
  local_490._8_8_ = (element_type *)0x0;
  aStack_480._M_allocated_capacity = 0;
  local_4b0._M_dataplus._M_p = "test_args.m_settings.ro_config[\"sec2\"].count(\"ccc\")";
  local_4b0._M_string_length = 0xb533c2;
  local_470._8_8_ = local_470._8_8_ & 0xffffffffffffff00;
  local_470._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_460._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_960 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_958 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_460._8_8_ = &local_4b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_490,(lazy_ostream *)local_470,1,0,WARN,_cVar16,
             (size_t)&local_960,0x1d9);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_480._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_450);
  std::__cxx11::string::~string((string *)local_410);
  local_970 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_968 = "";
  local_980 = &boost::unit_test::basic_cstring<char_const>::null;
  local_978 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = pvVar9;
  msg_15.m_begin = pvVar8;
  file_15.m_end = (iterator)0x1da;
  file_15.m_begin = (iterator)&local_970;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_980,
             msg_15);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"sec2",(allocator<char> *)local_4d0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
           ::operator[](this_00,(key_type *)local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_450,"iii",(allocator<char> *)local_4f0);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
          ::count(pmVar6,(key_type *)local_450);
  local_490[0] = (class_property<bool>)(class_property<bool>)(sVar7 != 0);
  local_490._8_8_ = (element_type *)0x0;
  aStack_480._M_allocated_capacity = 0;
  local_4b0._M_dataplus._M_p = "test_args.m_settings.ro_config[\"sec2\"].count(\"iii\")";
  local_4b0._M_string_length = 0xb533f6;
  local_470._8_8_ = local_470._8_8_ & 0xffffffffffffff00;
  local_470._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_460._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_990 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_988 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_460._8_8_ = &local_4b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_490,(lazy_ostream *)local_470,1,0,WARN,_cVar16,
             (size_t)&local_990,0x1da);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_480._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_450);
  std::__cxx11::string::~string((string *)local_410);
  local_9a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_998 = "";
  local_9b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_16.m_end = pvVar9;
  msg_16.m_begin = pvVar8;
  file_16.m_end = (iterator)0x1dc;
  file_16.m_begin = (iterator)&local_9a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_9b0,
             msg_16);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-a",(allocator<char> *)&local_4b0);
  rVar2.super_class_property<bool>.value =
       (class_property<bool>)ArgsManager::IsArgSet(&test_args.super_ArgsManager,(string *)local_410)
  ;
  local_470._8_8_ = (element_type *)0x0;
  aStack_460._M_allocated_capacity = 0;
  local_490._0_8_ = "test_args.IsArgSet(\"-a\")";
  local_490._8_8_ = "";
  local_450._8_8_ = local_450._8_8_ & 0xffffffffffffff00;
  local_450._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_440._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_9c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_9b8 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_440._8_8_ = (assertion_result *)local_490;
  local_470[0] = rVar2.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_470,(lazy_ostream *)local_450,1,0,WARN,_cVar16,
             (size_t)&local_9c0,0x1dc);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_460._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_410);
  local_9d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_9c8 = "";
  local_9e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_17.m_end = pvVar9;
  msg_17.m_begin = pvVar8;
  file_17.m_end = (iterator)0x1dd;
  file_17.m_begin = (iterator)&local_9d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_9e0,
             msg_17);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-b",(allocator<char> *)&local_4b0);
  local_470[0] = (class_property<bool>)
                 ArgsManager::IsArgSet(&test_args.super_ArgsManager,(string *)local_410);
  local_470._8_8_ = (element_type *)0x0;
  aStack_460._M_allocated_capacity = 0;
  local_490._0_8_ = "test_args.IsArgSet(\"-b\")";
  local_490._8_8_ = "";
  local_450._8_8_ = local_450._8_8_ & 0xffffffffffffff00;
  local_450._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_440._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_9f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_9e8 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_440._8_8_ = (assertion_result *)local_490;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_470,(lazy_ostream *)local_450,1,0,WARN,_cVar16,
             (size_t)&local_9f0,0x1dd);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_460._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_410);
  local_a00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_9f8 = "";
  local_a10 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a08 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_18.m_end = pvVar9;
  msg_18.m_begin = pvVar8;
  file_18.m_end = (iterator)0x1de;
  file_18.m_begin = (iterator)&local_a00;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_a10,
             msg_18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-ccc",(allocator<char> *)&local_4b0);
  local_470[0] = (class_property<bool>)
                 ArgsManager::IsArgSet(&test_args.super_ArgsManager,(string *)local_410);
  local_470._8_8_ = (element_type *)0x0;
  aStack_460._M_allocated_capacity = 0;
  local_490._0_8_ = "test_args.IsArgSet(\"-ccc\")";
  local_490._8_8_ = "";
  local_450._8_8_ = local_450._8_8_ & 0xffffffffffffff00;
  local_450._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_440._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_a20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_a18 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_440._8_8_ = (assertion_result *)local_490;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_470,(lazy_ostream *)local_450,1,0,WARN,_cVar16,
             (size_t)&local_a20,0x1de);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_460._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_410);
  local_a30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_a28 = "";
  local_a40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a38 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_19.m_end = pvVar9;
  msg_19.m_begin = pvVar8;
  file_19.m_end = (iterator)0x1df;
  file_19.m_begin = (iterator)&local_a30;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_a40,
             msg_19);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-d",(allocator<char> *)&local_4b0);
  local_470[0] = (class_property<bool>)
                 ArgsManager::IsArgSet(&test_args.super_ArgsManager,(string *)local_410);
  local_470._8_8_ = (element_type *)0x0;
  aStack_460._M_allocated_capacity = 0;
  local_490._0_8_ = "test_args.IsArgSet(\"-d\")";
  local_490._8_8_ = "";
  local_450._8_8_ = local_450._8_8_ & 0xffffffffffffff00;
  local_450._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_440._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_a50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_a48 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_440._8_8_ = (assertion_result *)local_490;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_470,(lazy_ostream *)local_450,1,0,WARN,_cVar16,
             (size_t)&local_a50,0x1df);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_460._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_410);
  local_a60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_a58 = "";
  local_a70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a68 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_20.m_end = pvVar9;
  msg_20.m_begin = pvVar8;
  file_20.m_end = (iterator)0x1e0;
  file_20.m_begin = (iterator)&local_a60;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_a70,
             msg_20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-fff",(allocator<char> *)&local_4b0);
  local_470[0] = (class_property<bool>)
                 ArgsManager::IsArgSet(&test_args.super_ArgsManager,(string *)local_410);
  local_470._8_8_ = (element_type *)0x0;
  aStack_460._M_allocated_capacity = 0;
  local_490._0_8_ = "test_args.IsArgSet(\"-fff\")";
  local_490._8_8_ = "";
  local_450._8_8_ = local_450._8_8_ & 0xffffffffffffff00;
  local_450._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_440._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_a80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_a78 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_440._8_8_ = (assertion_result *)local_490;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_470,(lazy_ostream *)local_450,1,0,WARN,_cVar16,
             (size_t)&local_a80,0x1e0);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_460._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_410);
  local_a90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_a88 = "";
  local_aa0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a98 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_21.m_end = pvVar9;
  msg_21.m_begin = pvVar8;
  file_21.m_end = (iterator)0x1e1;
  file_21.m_begin = (iterator)&local_a90;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_aa0,
             msg_21);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-ggg",(allocator<char> *)&local_4b0);
  local_470[0] = (class_property<bool>)
                 ArgsManager::IsArgSet(&test_args.super_ArgsManager,(string *)local_410);
  local_470._8_8_ = (element_type *)0x0;
  aStack_460._M_allocated_capacity = 0;
  local_490._0_8_ = "test_args.IsArgSet(\"-ggg\")";
  local_490._8_8_ = "";
  local_450._8_8_ = local_450._8_8_ & 0xffffffffffffff00;
  local_450._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_440._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_ab0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_aa8 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_440._8_8_ = (assertion_result *)local_490;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_470,(lazy_ostream *)local_450,1,0,WARN,_cVar16,
             (size_t)&local_ab0,0x1e1);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_460._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_410);
  local_ac0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_ab8 = "";
  local_ad0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ac8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_22.m_end = pvVar9;
  msg_22.m_begin = pvVar8;
  file_22.m_end = (iterator)0x1e2;
  file_22.m_begin = (iterator)&local_ac0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_ad0,
             msg_22);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-h",(allocator<char> *)&local_4b0);
  local_470[0] = (class_property<bool>)
                 ArgsManager::IsArgSet(&test_args.super_ArgsManager,(string *)local_410);
  local_470._8_8_ = (element_type *)0x0;
  aStack_460._M_allocated_capacity = 0;
  local_490._0_8_ = "test_args.IsArgSet(\"-h\")";
  local_490._8_8_ = "";
  local_450._8_8_ = local_450._8_8_ & 0xffffffffffffff00;
  local_450._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_440._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_ae0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_ad8 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_440._8_8_ = (assertion_result *)local_490;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_470,(lazy_ostream *)local_450,1,0,WARN,_cVar16,
             (size_t)&local_ae0,0x1e2);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_460._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_410);
  local_af0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_ae8 = "";
  local_b00 = &boost::unit_test::basic_cstring<char_const>::null;
  local_af8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_23.m_end = pvVar9;
  msg_23.m_begin = pvVar8;
  file_23.m_end = (iterator)0x1e3;
  file_23.m_begin = (iterator)&local_af0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_b00,
             msg_23);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-i",(allocator<char> *)&local_4b0);
  local_470[0] = (class_property<bool>)
                 ArgsManager::IsArgSet(&test_args.super_ArgsManager,(string *)local_410);
  local_470._8_8_ = (element_type *)0x0;
  aStack_460._M_allocated_capacity = 0;
  local_490._0_8_ = "test_args.IsArgSet(\"-i\")";
  local_490._8_8_ = "";
  local_450._8_8_ = local_450._8_8_ & 0xffffffffffffff00;
  local_450._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_440._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_b10 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_b08 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_440._8_8_ = (assertion_result *)local_490;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_470,(lazy_ostream *)local_450,1,0,WARN,_cVar16,
             (size_t)&local_b10,0x1e3);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_460._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_410);
  local_b20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_b18 = "";
  local_b30 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b28 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_24.m_end = pvVar9;
  msg_24.m_begin = pvVar8;
  file_24.m_end = (iterator)0x1e4;
  file_24.m_begin = (iterator)&local_b20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_b30,
             msg_24);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-zzz",(allocator<char> *)&local_4b0);
  bVar3 = ArgsManager::IsArgSet(&test_args.super_ArgsManager,(string *)local_410);
  local_470[0] = (class_property<bool>)!bVar3;
  local_470._8_8_ = (element_type *)0x0;
  aStack_460._M_allocated_capacity = 0;
  local_490._0_8_ = "!test_args.IsArgSet(\"-zzz\")";
  local_490._8_8_ = "";
  local_450._8_8_ = local_450._8_8_ & 0xffffffffffffff00;
  local_450._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_440._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_b40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_b38 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_440._8_8_ = (assertion_result *)local_490;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_470,(lazy_ostream *)local_450,1,0,WARN,_cVar16,
             (size_t)&local_b40,0x1e4);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_460._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_410);
  local_b50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_b48 = "";
  local_b60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b58 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_25.m_end = pvVar9;
  msg_25.m_begin = pvVar8;
  file_25.m_end = (iterator)0x1e5;
  file_25.m_begin = (iterator)&local_b50;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_b60,
             msg_25);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-iii",(allocator<char> *)&local_4b0);
  bVar3 = ArgsManager::IsArgSet(&test_args.super_ArgsManager,(string *)local_410);
  local_470[0] = (class_property<bool>)(class_property<bool>)!bVar3;
  local_470._8_8_ = (element_type *)0x0;
  aStack_460._M_allocated_capacity = 0;
  local_490._0_8_ = "!test_args.IsArgSet(\"-iii\")";
  local_490._8_8_ = "";
  local_450._8_8_ = local_450._8_8_ & 0xffffffffffffff00;
  local_450._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_440._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_b70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_b68 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_440._8_8_ = (assertion_result *)local_490;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_470,(lazy_ostream *)local_450,1,0,WARN,_cVar16,
             (size_t)&local_b70,0x1e5);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_460._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_410);
  local_b80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_b78 = "";
  local_b90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b88 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_26.m_end = pvVar9;
  msg_26.m_begin = pvVar8;
  file_26.m_end = (iterator)0x1e7;
  file_26.m_begin = (iterator)&local_b80;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_b90,
             msg_26);
  local_410[8] = false;
  local_410._0_8_ = &PTR__lazy_ostream_01139f30;
  local_400 = boost::unit_test::lazy_ostream::inst;
  local_3f8 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_ba0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_b98 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_470,"-a",(allocator<char> *)&local_4b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_490,"xxx",(allocator<char> *)local_4d0);
  ArgsManager::GetArg((string *)local_450,&test_args.super_ArgsManager,(string *)local_470,
                      (string *)local_490);
  pvVar9 = (iterator)0x2;
  pvVar8 = local_450;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (local_410,&local_ba0,0x1e7,1,2,pvVar8,0xb53502,"","\"\"");
  std::__cxx11::string::~string((string *)local_450);
  std::__cxx11::string::~string((string *)local_490);
  std::__cxx11::string::~string((string *)local_470);
  local_bb0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_ba8 = "";
  local_bc0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bb8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_27.m_end = pvVar8;
  msg_27.m_begin = pvVar9;
  file_27.m_end = (iterator)0x1e8;
  file_27.m_begin = (iterator)&local_bb0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_bc0,
             msg_27);
  local_410[8] = false;
  local_410._0_8_ = &PTR__lazy_ostream_01139f30;
  local_400 = boost::unit_test::lazy_ostream::inst;
  local_3f8 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_bd0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_bc8 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_470,"-b",(allocator<char> *)&local_4b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_490,"xxx",(allocator<char> *)local_4d0);
  ArgsManager::GetArg((string *)local_450,&test_args.super_ArgsManager,(string *)local_470,
                      (string *)local_490);
  pvVar9 = (iterator)0x2;
  pvVar8 = local_450;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
            (local_410,&local_bd0,0x1e8,1,2,pvVar8,0xb53520,"1","\"1\"");
  std::__cxx11::string::~string((string *)local_450);
  std::__cxx11::string::~string((string *)local_490);
  std::__cxx11::string::~string((string *)local_470);
  local_be0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_bd8 = "";
  local_bf0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_be8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_28.m_end = pvVar8;
  msg_28.m_begin = pvVar9;
  file_28.m_end = (iterator)0x1e9;
  file_28.m_begin = (iterator)&local_be0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_bf0,
             msg_28);
  local_410[8] = false;
  local_410._0_8_ = &PTR__lazy_ostream_01139f30;
  local_400 = boost::unit_test::lazy_ostream::inst;
  local_3f8 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_c00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_bf8 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_470,"-ccc",(allocator<char> *)&local_4b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_490,"xxx",(allocator<char> *)local_4d0);
  ArgsManager::GetArg((string *)local_450,&test_args.super_ArgsManager,(string *)local_470,
                      (string *)local_490);
  pvVar9 = (iterator)0x2;
  pvVar8 = local_450;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[9]>
            (local_410,&local_c00,0x1e9,1,2,pvVar8,0xb5353e,"argument","\"argument\"");
  std::__cxx11::string::~string((string *)local_450);
  std::__cxx11::string::~string((string *)local_490);
  std::__cxx11::string::~string((string *)local_470);
  local_c10 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_c08 = "";
  local_c20 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c18 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_29.m_end = pvVar8;
  msg_29.m_begin = pvVar9;
  file_29.m_end = (iterator)0x1ea;
  file_29.m_begin = (iterator)&local_c10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_c20,
             msg_29);
  local_410[8] = false;
  local_410._0_8_ = &PTR__lazy_ostream_01139f30;
  local_400 = boost::unit_test::lazy_ostream::inst;
  local_3f8 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_c30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_c28 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_470,"-d",(allocator<char> *)&local_4b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_490,"xxx",(allocator<char> *)local_4d0);
  ArgsManager::GetArg((string *)local_450,&test_args.super_ArgsManager,(string *)local_470,
                      (string *)local_490);
  pvVar9 = (iterator)0x2;
  pvVar8 = local_450;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
            (local_410,&local_c30,0x1ea,1,2,pvVar8,0xb5355e,"e","\"e\"");
  std::__cxx11::string::~string((string *)local_450);
  std::__cxx11::string::~string((string *)local_490);
  std::__cxx11::string::~string((string *)local_470);
  local_c40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_c38 = "";
  local_c50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c48 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_30.m_end = pvVar8;
  msg_30.m_begin = pvVar9;
  file_30.m_end = (iterator)0x1eb;
  file_30.m_begin = (iterator)&local_c40;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_c50,
             msg_30);
  local_410[8] = false;
  local_410._0_8_ = &PTR__lazy_ostream_01139f30;
  local_400 = boost::unit_test::lazy_ostream::inst;
  local_3f8 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_c60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_c58 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_470,"-fff",(allocator<char> *)&local_4b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_490,"xxx",(allocator<char> *)local_4d0);
  ArgsManager::GetArg((string *)local_450,&test_args.super_ArgsManager,(string *)local_470,
                      (string *)local_490);
  pvVar9 = (iterator)0x2;
  pvVar8 = local_450;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
            (local_410,&local_c60,0x1eb,1,2,pvVar8,0xb5357c,"0","\"0\"");
  std::__cxx11::string::~string((string *)local_450);
  std::__cxx11::string::~string((string *)local_490);
  std::__cxx11::string::~string((string *)local_470);
  local_c70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_c68 = "";
  local_c80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c78 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_31.m_end = pvVar8;
  msg_31.m_begin = pvVar9;
  file_31.m_end = (iterator)0x1ec;
  file_31.m_begin = (iterator)&local_c70;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_c80,
             msg_31);
  local_410[8] = false;
  local_410._0_8_ = &PTR__lazy_ostream_01139f30;
  local_400 = boost::unit_test::lazy_ostream::inst;
  local_3f8 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_c90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_c88 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_470,"-ggg",(allocator<char> *)&local_4b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_490,"xxx",(allocator<char> *)local_4d0);
  ArgsManager::GetArg((string *)local_450,&test_args.super_ArgsManager,(string *)local_470,
                      (string *)local_490);
  pvVar9 = (iterator)0x2;
  pvVar8 = local_450;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
            (local_410,&local_c90,0x1ec,1,2,pvVar8,0xb5359c,"1","\"1\"");
  std::__cxx11::string::~string((string *)local_450);
  std::__cxx11::string::~string((string *)local_490);
  std::__cxx11::string::~string((string *)local_470);
  local_ca0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_c98 = "";
  local_cb0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ca8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_32.m_end = pvVar8;
  msg_32.m_begin = pvVar9;
  file_32.m_end = (iterator)0x1ed;
  file_32.m_begin = (iterator)&local_ca0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_cb0,
             msg_32);
  local_410[8] = false;
  local_410._0_8_ = &PTR__lazy_ostream_01139f30;
  local_400 = boost::unit_test::lazy_ostream::inst;
  local_3f8 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_cc0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_cb8 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_470,"-h",(allocator<char> *)&local_4b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_490,"xxx",(allocator<char> *)local_4d0);
  ArgsManager::GetArg((string *)local_450,&test_args.super_ArgsManager,(string *)local_470,
                      (string *)local_490);
  pvVar9 = (iterator)0x2;
  pvVar8 = local_450;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
            (local_410,&local_cc0,0x1ed,1,2,pvVar8,0xb535bc,"0","\"0\"");
  std::__cxx11::string::~string((string *)local_450);
  std::__cxx11::string::~string((string *)local_490);
  std::__cxx11::string::~string((string *)local_470);
  local_cd0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_cc8 = "";
  local_ce0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_cd8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_33.m_end = pvVar8;
  msg_33.m_begin = pvVar9;
  file_33.m_end = (iterator)0x1ee;
  file_33.m_begin = (iterator)&local_cd0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_ce0,
             msg_33);
  local_410[8] = false;
  local_410._0_8_ = &PTR__lazy_ostream_01139f30;
  local_400 = boost::unit_test::lazy_ostream::inst;
  local_3f8 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_cf0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_ce8 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_470,"-i",(allocator<char> *)&local_4b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_490,"xxx",(allocator<char> *)local_4d0);
  ArgsManager::GetArg((string *)local_450,&test_args.super_ArgsManager,(string *)local_470,
                      (string *)local_490);
  pvVar9 = (iterator)0x2;
  pvVar8 = local_450;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
            (local_410,&local_cf0,0x1ee,1,2,pvVar8,0xb535da,"1","\"1\"");
  std::__cxx11::string::~string((string *)local_450);
  std::__cxx11::string::~string((string *)local_490);
  std::__cxx11::string::~string((string *)local_470);
  local_d00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_cf8 = "";
  local_d10 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d08 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_34.m_end = pvVar8;
  msg_34.m_begin = pvVar9;
  file_34.m_end = (iterator)0x1ef;
  file_34.m_begin = (iterator)&local_d00;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_d10,
             msg_34);
  local_410[8] = false;
  local_410._0_8_ = &PTR__lazy_ostream_01139f30;
  local_400 = boost::unit_test::lazy_ostream::inst;
  local_3f8 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_d20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_d18 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_470,"-zzz",(allocator<char> *)&local_4b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_490,"xxx",(allocator<char> *)local_4d0);
  ArgsManager::GetArg((string *)local_450,&test_args.super_ArgsManager,(string *)local_470,
                      (string *)local_490);
  pvVar9 = (iterator)0x2;
  pvVar8 = local_450;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
            (local_410,&local_d20,0x1ef,1,2,pvVar8,0xb535f8,"xxx","\"xxx\"");
  std::__cxx11::string::~string((string *)local_450);
  std::__cxx11::string::~string((string *)local_490);
  std::__cxx11::string::~string((string *)local_470);
  local_d30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_d28 = "";
  local_d40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d38 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_35.m_end = pvVar8;
  msg_35.m_begin = pvVar9;
  file_35.m_end = (iterator)0x1f0;
  file_35.m_begin = (iterator)&local_d30;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_d40,
             msg_35);
  local_410[8] = false;
  local_410._0_8_ = &PTR__lazy_ostream_01139f30;
  local_400 = boost::unit_test::lazy_ostream::inst;
  local_3f8 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_d50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_d48 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_470,"-iii",(allocator<char> *)&local_4b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_490,"xxx",(allocator<char> *)local_4d0);
  ArgsManager::GetArg((string *)local_450,&test_args.super_ArgsManager,(string *)local_470,
                      (string *)local_490);
  pcVar13 = "xxx";
  pvVar9 = (iterator)0x2;
  pvVar8 = local_450;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
            (local_410,&local_d50,0x1f0);
  std::__cxx11::string::~string((string *)local_450);
  std::__cxx11::string::~string((string *)local_490);
  std::__cxx11::string::~string((string *)local_470);
  local_4b0._M_dataplus._M_p._0_2_ = 0x100;
  for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
    bVar3 = *(bool *)((long)&local_4b0._M_dataplus._M_p + lVar10);
    local_d60 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_d58 = "";
    local_d70 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d68 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_36.m_end = pvVar8;
    msg_36.m_begin = pvVar9;
    file_36.m_end = (iterator)0x1f3;
    file_36.m_begin = (iterator)&local_d60;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_d70,
               msg_36);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_410,"-a",(allocator<char> *)local_4d0);
    rVar2.super_class_property<bool>.value =
         (class_property<bool>)
         ArgsManager::GetBoolArg(&test_args.super_ArgsManager,(string *)local_410,bVar3);
    local_470._8_8_ = (element_type *)0x0;
    aStack_460._M_allocated_capacity = 0;
    local_490._0_8_ = "test_args.GetBoolArg(\"-a\", def)";
    local_490._8_8_ = "";
    local_450._8_8_ = local_450._8_8_ & 0xffffffffffffff00;
    local_450._0_8_ = &PTR__lazy_ostream_0113a070;
    aStack_440._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_440._8_8_ = local_490;
    local_d80 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_d78 = "";
    pvVar8 = &DAT_00000001;
    pvVar9 = (iterator)0x0;
    local_470[0] = rVar2.super_class_property<bool>.value;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_470,(lazy_ostream *)local_450,1,0,WARN,(check_type)pcVar13,
               (size_t)&local_d80,499);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_460._M_allocated_capacity);
    std::__cxx11::string::~string((string *)local_410);
    local_d90 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_d88 = "";
    local_da0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d98 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_37.m_end = pvVar9;
    msg_37.m_begin = pvVar8;
    file_37.m_end = (iterator)0x1f4;
    file_37.m_begin = (iterator)&local_d90;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_da0,
               msg_37);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_410,"-b",(allocator<char> *)local_4d0);
    local_470[0] = (class_property<bool>)
                   ArgsManager::GetBoolArg(&test_args.super_ArgsManager,(string *)local_410,bVar3);
    local_470._8_8_ = (element_type *)0x0;
    aStack_460._M_allocated_capacity = 0;
    local_490._0_8_ = "test_args.GetBoolArg(\"-b\", def)";
    local_490._8_8_ = "";
    local_450._8_8_ = local_450._8_8_ & 0xffffffffffffff00;
    local_450._0_8_ = &PTR__lazy_ostream_0113a070;
    aStack_440._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_440._8_8_ = local_490;
    local_db0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_da8 = "";
    pvVar8 = &DAT_00000001;
    pvVar9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_470,(lazy_ostream *)local_450,1,0,WARN,(check_type)pcVar13,
               (size_t)&local_db0,500);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_460._M_allocated_capacity);
    std::__cxx11::string::~string((string *)local_410);
    local_dc0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_db8 = "";
    local_dd0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_dc8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_38.m_end = pvVar9;
    msg_38.m_begin = pvVar8;
    file_38.m_end = (iterator)0x1f5;
    file_38.m_begin = (iterator)&local_dc0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_dd0,
               msg_38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_410,"-ccc",(allocator<char> *)local_4d0);
    bVar4 = ArgsManager::GetBoolArg(&test_args.super_ArgsManager,(string *)local_410,bVar3);
    local_470[0] = (class_property<bool>)!bVar4;
    local_470._8_8_ = (element_type *)0x0;
    aStack_460._M_allocated_capacity = 0;
    local_490._0_8_ = "!test_args.GetBoolArg(\"-ccc\", def)";
    local_490._8_8_ = "";
    local_450._8_8_ = local_450._8_8_ & 0xffffffffffffff00;
    local_450._0_8_ = &PTR__lazy_ostream_0113a070;
    aStack_440._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_440._8_8_ = local_490;
    local_de0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_dd8 = "";
    pvVar8 = &DAT_00000001;
    pvVar9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_470,(lazy_ostream *)local_450,1,0,WARN,(check_type)pcVar13,
               (size_t)&local_de0,0x1f5);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_460._M_allocated_capacity);
    std::__cxx11::string::~string((string *)local_410);
    local_df0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_de8 = "";
    local_e00 = &boost::unit_test::basic_cstring<char_const>::null;
    local_df8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_39.m_end = pvVar9;
    msg_39.m_begin = pvVar8;
    file_39.m_end = (iterator)0x1f6;
    file_39.m_begin = (iterator)&local_df0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_e00,
               msg_39);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_410,"-d",(allocator<char> *)local_4d0);
    bVar4 = ArgsManager::GetBoolArg(&test_args.super_ArgsManager,(string *)local_410,bVar3);
    local_470[0] = (class_property<bool>)!bVar4;
    local_470._8_8_ = (element_type *)0x0;
    aStack_460._M_allocated_capacity = 0;
    local_490._0_8_ = "!test_args.GetBoolArg(\"-d\", def)";
    local_490._8_8_ = "";
    local_450._8_8_ = local_450._8_8_ & 0xffffffffffffff00;
    local_450._0_8_ = &PTR__lazy_ostream_0113a070;
    aStack_440._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_440._8_8_ = local_490;
    local_e10 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_e08 = "";
    pvVar8 = &DAT_00000001;
    pvVar9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_470,(lazy_ostream *)local_450,1,0,WARN,(check_type)pcVar13,
               (size_t)&local_e10,0x1f6);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_460._M_allocated_capacity);
    std::__cxx11::string::~string((string *)local_410);
    local_e20 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_e18 = "";
    local_e30 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e28 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_40.m_end = pvVar9;
    msg_40.m_begin = pvVar8;
    file_40.m_end = (iterator)0x1f7;
    file_40.m_begin = (iterator)&local_e20;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_e30,
               msg_40);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_410,"-fff",(allocator<char> *)local_4d0);
    bVar4 = ArgsManager::GetBoolArg(&test_args.super_ArgsManager,(string *)local_410,bVar3);
    local_470[0] = (class_property<bool>)!bVar4;
    local_470._8_8_ = (element_type *)0x0;
    aStack_460._M_allocated_capacity = 0;
    local_490._0_8_ = "!test_args.GetBoolArg(\"-fff\", def)";
    local_490._8_8_ = "";
    local_450._8_8_ = local_450._8_8_ & 0xffffffffffffff00;
    local_450._0_8_ = &PTR__lazy_ostream_0113a070;
    aStack_440._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_440._8_8_ = local_490;
    local_e40 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_e38 = "";
    pvVar8 = &DAT_00000001;
    pvVar9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_470,(lazy_ostream *)local_450,1,0,WARN,(check_type)pcVar13,
               (size_t)&local_e40,0x1f7);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_460._M_allocated_capacity);
    std::__cxx11::string::~string((string *)local_410);
    local_e50 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_e48 = "";
    local_e60 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e58 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_41.m_end = pvVar9;
    msg_41.m_begin = pvVar8;
    file_41.m_end = (iterator)0x1f8;
    file_41.m_begin = (iterator)&local_e50;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_e60,
               msg_41);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_410,"-ggg",(allocator<char> *)local_4d0);
    local_470[0] = (class_property<bool>)
                   ArgsManager::GetBoolArg(&test_args.super_ArgsManager,(string *)local_410,bVar3);
    local_470._8_8_ = (element_type *)0x0;
    aStack_460._M_allocated_capacity = 0;
    local_490._0_8_ = "test_args.GetBoolArg(\"-ggg\", def)";
    local_490._8_8_ = "";
    local_450._8_8_ = local_450._8_8_ & 0xffffffffffffff00;
    local_450._0_8_ = &PTR__lazy_ostream_0113a070;
    aStack_440._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_440._8_8_ = local_490;
    local_e70 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_e68 = "";
    pvVar8 = &DAT_00000001;
    pvVar9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_470,(lazy_ostream *)local_450,1,0,WARN,(check_type)pcVar13,
               (size_t)&local_e70,0x1f8);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_460._M_allocated_capacity);
    std::__cxx11::string::~string((string *)local_410);
    local_e80 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_e78 = "";
    local_e90 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e88 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_42.m_end = pvVar9;
    msg_42.m_begin = pvVar8;
    file_42.m_end = (iterator)0x1f9;
    file_42.m_begin = (iterator)&local_e80;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_e90,
               msg_42);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_410,"-h",(allocator<char> *)local_4d0);
    bVar4 = ArgsManager::GetBoolArg(&test_args.super_ArgsManager,(string *)local_410,bVar3);
    local_470[0] = (class_property<bool>)!bVar4;
    local_470._8_8_ = (element_type *)0x0;
    aStack_460._M_allocated_capacity = 0;
    local_490._0_8_ = "!test_args.GetBoolArg(\"-h\", def)";
    local_490._8_8_ = "";
    local_450._8_8_ = local_450._8_8_ & 0xffffffffffffff00;
    local_450._0_8_ = &PTR__lazy_ostream_0113a070;
    aStack_440._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_440._8_8_ = local_490;
    local_ea0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_e98 = "";
    pvVar8 = &DAT_00000001;
    pvVar9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_470,(lazy_ostream *)local_450,1,0,WARN,(check_type)pcVar13,
               (size_t)&local_ea0,0x1f9);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_460._M_allocated_capacity);
    std::__cxx11::string::~string((string *)local_410);
    local_eb0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_ea8 = "";
    local_ec0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_eb8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_43.m_end = pvVar9;
    msg_43.m_begin = pvVar8;
    file_43.m_end = (iterator)0x1fa;
    file_43.m_begin = (iterator)&local_eb0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_ec0,
               msg_43);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_410,"-i",(allocator<char> *)local_4d0);
    local_470[0] = (class_property<bool>)
                   ArgsManager::GetBoolArg(&test_args.super_ArgsManager,(string *)local_410,bVar3);
    local_470._8_8_ = (element_type *)0x0;
    aStack_460._M_allocated_capacity = 0;
    local_490._0_8_ = "test_args.GetBoolArg(\"-i\", def)";
    local_490._8_8_ = "";
    local_450._8_8_ = local_450._8_8_ & 0xffffffffffffff00;
    local_450._0_8_ = &PTR__lazy_ostream_0113a070;
    aStack_440._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_440._8_8_ = local_490;
    local_ed0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_ec8 = "";
    pvVar8 = &DAT_00000001;
    pvVar9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_470,(lazy_ostream *)local_450,1,0,WARN,(check_type)pcVar13,
               (size_t)&local_ed0,0x1fa);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_460._M_allocated_capacity);
    std::__cxx11::string::~string((string *)local_410);
    local_ee0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_ed8 = "";
    local_ef0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_ee8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_44.m_end = pvVar9;
    msg_44.m_begin = pvVar8;
    file_44.m_end = (iterator)0x1fb;
    file_44.m_begin = (iterator)&local_ee0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_ef0,
               msg_44);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_410,"-zzz",(allocator<char> *)local_4d0);
    bVar4 = ArgsManager::GetBoolArg(&test_args.super_ArgsManager,(string *)local_410,bVar3);
    local_470[0] = (class_property<bool>)(bVar3 == bVar4);
    local_470._8_8_ = (element_type *)0x0;
    aStack_460._M_allocated_capacity = 0;
    local_490._0_8_ = "test_args.GetBoolArg(\"-zzz\", def) == def";
    local_490._8_8_ = "";
    local_450._8_8_ = local_450._8_8_ & 0xffffffffffffff00;
    local_450._0_8_ = &PTR__lazy_ostream_0113a070;
    aStack_440._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_440._8_8_ = local_490;
    local_f00 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_ef8 = "";
    pvVar8 = &DAT_00000001;
    pvVar9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_470,(lazy_ostream *)local_450,1,0,WARN,(check_type)pcVar13,
               (size_t)&local_f00,0x1fb);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_460._M_allocated_capacity);
    std::__cxx11::string::~string((string *)local_410);
    local_f10 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_f08 = "";
    local_f20 = &boost::unit_test::basic_cstring<char_const>::null;
    local_f18 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_45.m_end = pvVar9;
    msg_45.m_begin = pvVar8;
    file_45.m_end = (iterator)0x1fc;
    file_45.m_begin = (iterator)&local_f10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_f20,
               msg_45);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_410,"-iii",(allocator<char> *)local_4d0);
    bVar4 = ArgsManager::GetBoolArg(&test_args.super_ArgsManager,(string *)local_410,bVar3);
    local_470[0] = (class_property<bool>)(class_property<bool>)(bVar3 == bVar4);
    local_470._8_8_ = (element_type *)0x0;
    aStack_460._M_allocated_capacity = 0;
    local_490._0_8_ = "test_args.GetBoolArg(\"-iii\", def) == def";
    local_490._8_8_ = "";
    local_450._8_8_ = local_450._8_8_ & 0xffffffffffffff00;
    local_450._0_8_ = &PTR__lazy_ostream_0113a070;
    aStack_440._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_440._8_8_ = local_490;
    local_f30 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_f28 = "";
    pvVar9 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_470,(lazy_ostream *)local_450,1,0,WARN,(check_type)pcVar13,
               (size_t)&local_f30,0x1fc);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_460._M_allocated_capacity);
    std::__cxx11::string::~string((string *)local_410);
  }
  local_f40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_f38 = "";
  local_f50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f48 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_46.m_end = pvVar8;
  msg_46.m_begin = pvVar9;
  file_46.m_end = (iterator)0x200;
  file_46.m_begin = (iterator)&local_f40;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_f50,
             msg_46);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-a",(allocator<char> *)local_4f0);
  ArgsManager::GetArgs
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_4b0,&test_args.super_ArgsManager,(string *)local_410);
  lVar10 = local_4b0._M_string_length - (long)local_4b0._M_dataplus._M_p;
  if (lVar10 == 0x20) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_450,"-a",&local_f69);
    ArgsManager::GetArgs(&local_f68,&test_args.super_ArgsManager,(string *)local_450);
    rVar2.super_class_property<bool>.value =
         (class_property<bool>)
         std::operator==(local_f68.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,"");
  }
  else {
    rVar2.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_490[0] = rVar2.super_class_property<bool>.value;
  local_490._8_8_ = (element_type *)0x0;
  aStack_480._M_allocated_capacity = 0;
  local_4d0._0_8_ =
       "test_args.GetArgs(\"-a\").size() == 1 && test_args.GetArgs(\"-a\").front() == \"\"";
  local_4d0._8_8_ = "";
  local_470._8_8_ = local_470._8_8_ & 0xffffffffffffff00;
  local_470._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_460._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_460._8_8_ = local_4d0;
  local_f80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_f78 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_490,(lazy_ostream *)local_470,1,0,WARN,(check_type)pcVar13,
             (size_t)&local_f80,0x200);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_480._M_allocated_capacity);
  if (lVar10 == 0x20) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_f68);
    std::__cxx11::string::~string((string *)local_450);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_4b0);
  std::__cxx11::string::~string((string *)local_410);
  local_f90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_f88 = "";
  local_fa0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f98 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_47.m_end = pvVar9;
  msg_47.m_begin = pvVar8;
  file_47.m_end = (iterator)0x202;
  file_47.m_begin = (iterator)&local_f90;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,(size_t)&local_fa0,
             msg_47);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-b",(allocator<char> *)local_510);
  ArgsManager::GetArgs
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_4d0,&test_args.super_ArgsManager,(string *)local_410);
  lVar10 = local_4d0._8_8_ - local_4d0._0_8_;
  if (lVar10 == 0x20) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_470,"-b",&local_fb9);
    ArgsManager::GetArgs(&local_fb8,&test_args.super_ArgsManager,(string *)local_470);
    bVar3 = std::operator==(local_fb8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,"1");
  }
  else {
    bVar3 = false;
  }
  local_4b0._M_dataplus._M_p._0_1_ = bVar3;
  local_4b0._M_string_length = 0;
  local_4b0.field_2._M_allocated_capacity = 0;
  local_4f0._0_8_ =
       "test_args.GetArgs(\"-b\").size() == 1 && test_args.GetArgs(\"-b\").front() == \"1\"";
  local_4f0._8_8_ = "";
  local_490._8_8_ = local_490._8_8_ & 0xffffffffffffff00;
  local_490._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_480._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_fd0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_fc8 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_480._8_8_ = (allocator<char> *)local_4f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_4b0,(lazy_ostream *)local_490,1,0,WARN,(check_type)pcVar13,
             (size_t)&local_fd0,0x202);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_4b0.field_2._M_allocated_capacity);
  if (lVar10 == 0x20) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_fb8);
    std::__cxx11::string::~string((string *)local_470);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_4d0);
  std::__cxx11::string::~string((string *)local_410);
  local_fe0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_fd8 = "";
  local_ff0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_fe8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_48.m_end = pvVar9;
  msg_48.m_begin = pvVar8;
  file_48.m_end = (iterator)0x205;
  file_48.m_begin = (iterator)&local_fe0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_48,(size_t)&local_ff0,
             msg_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-ccc",(allocator<char> *)local_550);
  ArgsManager::GetArgs
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_510,&test_args.super_ArgsManager,(string *)local_410);
  lVar10 = local_510._8_8_ - local_510._0_8_;
  bVar3 = false;
  rVar2.super_class_property<bool>.value = (class_property<bool>)false;
  if (lVar10 == 0x40) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_490,"-ccc",&local_1009);
    ArgsManager::GetArgs(&local_1008,&test_args.super_ArgsManager,(string *)local_490);
    bVar4 = std::operator==(local_1008.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,"argument");
    bVar3 = false;
    rVar2.super_class_property<bool>.value = (class_property<bool>)false;
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4b0,"-ccc",(allocator<char> *)((long)&local_1030 + 7));
      ArgsManager::GetArgs(&local_1028,&test_args.super_ArgsManager,&local_4b0);
      rVar2.super_class_property<bool>.value =
           (class_property<bool>)
           std::operator==(local_1028.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1,"multiple");
      bVar3 = true;
    }
  }
  local_4f0[0] = rVar2.super_class_property<bool>.value;
  local_4f0._8_8_ = (element_type *)0x0;
  aStack_4e0._M_allocated_capacity = 0;
  local_530._M_dataplus._M_p =
       "test_args.GetArgs(\"-ccc\").size() == 2 && test_args.GetArgs(\"-ccc\").front() == \"argument\" && test_args.GetArgs(\"-ccc\").back() == \"multiple\""
  ;
  local_530._M_string_length = 0xb538b9;
  local_4d0._8_8_ = local_4d0._8_8_ & 0xffffffffffffff00;
  local_4d0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_4d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1040 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1038 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_4d0._24_8_ = &local_530;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_4f0,(lazy_ostream *)local_4d0,1,0,WARN,(check_type)pcVar13,
             (size_t)&local_1040,0x205);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_4e0._M_allocated_capacity);
  if (bVar3) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1028);
    std::__cxx11::string::~string((string *)&local_4b0);
  }
  if (lVar10 == 0x40) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1008);
    std::__cxx11::string::~string((string *)local_490);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_510);
  std::__cxx11::string::~string((string *)local_410);
  local_1050 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1048 = "";
  local_1060 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1058 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_49.m_end = pvVar9;
  msg_49.m_begin = pvVar8;
  file_49.m_end = (iterator)0x206;
  file_49.m_begin = (iterator)&local_1050;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_49,(size_t)&local_1060,
             msg_49);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-fff",(allocator<char> *)local_550);
  ArgsManager::GetArgs
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_510,&test_args.super_ArgsManager,(string *)local_410);
  local_4f0._8_8_ = (element_type *)0x0;
  aStack_4e0._M_allocated_capacity = 0;
  local_530._M_dataplus._M_p = "test_args.GetArgs(\"-fff\").size() == 0";
  local_530._M_string_length = 0xb538df;
  local_4d0._8_8_ = local_4d0._8_8_ & 0xffffffffffffff00;
  local_4d0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_4d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1070 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1068 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_4d0._24_8_ = &local_530;
  local_4f0[0] = (class_property<bool>)(class_property<bool>)(local_510._8_8_ == local_510._0_8_);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_4f0,(lazy_ostream *)local_4d0,1,0,WARN,(check_type)pcVar13,
             (size_t)&local_1070,0x206);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_4e0._M_allocated_capacity);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_510);
  std::__cxx11::string::~string((string *)local_410);
  local_1080 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1078 = "";
  local_1090 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1088 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_50.m_end = pvVar9;
  msg_50.m_begin = pvVar8;
  file_50.m_end = (iterator)0x207;
  file_50.m_begin = (iterator)&local_1080;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_50,(size_t)&local_1090,
             msg_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-nofff",(allocator<char> *)local_550);
  ArgsManager::GetArgs
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_510,&test_args.super_ArgsManager,(string *)local_410);
  local_4f0[0] = (class_property<bool>)(class_property<bool>)(local_510._8_8_ == local_510._0_8_);
  local_4f0._8_8_ = (element_type *)0x0;
  aStack_4e0._M_allocated_capacity = 0;
  local_530._M_dataplus._M_p = "test_args.GetArgs(\"-nofff\").size() == 0";
  local_530._M_string_length = 0xb5390e;
  local_4d0._8_8_ = local_4d0._8_8_ & 0xffffffffffffff00;
  local_4d0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_4d0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_10a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1098 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_4d0._24_8_ = &local_530;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_4f0,(lazy_ostream *)local_4d0,1,0,WARN,(check_type)pcVar13,
             (size_t)&local_10a0,0x207);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_4e0._M_allocated_capacity);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_510);
  std::__cxx11::string::~string((string *)local_410);
  local_10b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_10a8 = "";
  local_10c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_10b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_51.m_end = pvVar9;
  msg_51.m_begin = pvVar8;
  file_51.m_end = (iterator)0x209;
  file_51.m_begin = (iterator)&local_10b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_51,(size_t)&local_10c0,
             msg_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-ggg",(allocator<char> *)&local_11b8);
  ArgsManager::GetArgs
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_530,&test_args.super_ArgsManager,(string *)local_410);
  lVar10 = local_530._M_string_length - (long)local_530._M_dataplus._M_p;
  if (lVar10 == 0x20) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_4d0,"-ggg",&local_10d9);
    ArgsManager::GetArgs(&local_10d8,&test_args.super_ArgsManager,(string *)local_4d0);
    bVar3 = std::operator==(local_10d8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,"1");
  }
  else {
    bVar3 = false;
  }
  local_510[0] = (class_property<bool>)(class_property<bool>)bVar3;
  local_510._8_8_ = (element_type *)0x0;
  aStack_500._M_allocated_capacity = 0;
  local_550._0_8_ =
       "test_args.GetArgs(\"-ggg\").size() == 1 && test_args.GetArgs(\"-ggg\").front() == \"1\"";
  local_550._8_8_ = "";
  local_4f0._8_8_ = local_4f0._8_8_ & 0xffffffffffffff00;
  local_4f0._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_4e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_10f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_10e8 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_4e0._8_8_ = (allocator<char> *)local_550;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_510,(lazy_ostream *)local_4f0,1,0,WARN,(check_type)pcVar13,
             (size_t)&local_10f0,0x209);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_500._M_allocated_capacity);
  if (lVar10 == 0x20) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_10d8);
    std::__cxx11::string::~string((string *)local_4d0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_530);
  std::__cxx11::string::~string((string *)local_410);
  local_1100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_10f8 = "";
  local_1110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1108 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_52.m_end = pvVar9;
  msg_52.m_begin = pvVar8;
  file_52.m_end = (iterator)0x20a;
  file_52.m_begin = (iterator)&local_1100;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_52,(size_t)&local_1110,
             msg_52);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-noggg",(allocator<char> *)&local_11b8);
  ArgsManager::GetArgs
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_530,&test_args.super_ArgsManager,(string *)local_410);
  local_510._8_8_ = (element_type *)0x0;
  aStack_500._M_allocated_capacity = 0;
  local_550._0_8_ = "test_args.GetArgs(\"-noggg\").size() == 0";
  local_550._8_8_ = "";
  local_4f0._8_8_ = local_4f0._8_8_ & 0xffffffffffffff00;
  local_4f0._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_4e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1118 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_4e0._8_8_ = (allocator<char> *)local_550;
  local_510[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((pointer)local_530._M_string_length == local_530._M_dataplus._M_p);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_510,(lazy_ostream *)local_4f0,1,0,WARN,(check_type)pcVar13,
             (size_t)&local_1120,0x20a);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_500._M_allocated_capacity);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_530);
  std::__cxx11::string::~string((string *)local_410);
  local_1130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1128 = "";
  local_1140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1138 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_53.m_end = pvVar9;
  msg_53.m_begin = pvVar8;
  file_53.m_end = (iterator)0x20b;
  file_53.m_begin = (iterator)&local_1130;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_53,(size_t)&local_1140,
             msg_53);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-h",(allocator<char> *)&local_11b8);
  ArgsManager::GetArgs
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_530,&test_args.super_ArgsManager,(string *)local_410);
  local_510[0] = (class_property<bool>)
                 ((pointer)local_530._M_string_length == local_530._M_dataplus._M_p);
  local_510._8_8_ = (element_type *)0x0;
  aStack_500._M_allocated_capacity = 0;
  local_550._0_8_ = "test_args.GetArgs(\"-h\").size() == 0";
  local_550._8_8_ = "";
  local_4f0._8_8_ = local_4f0._8_8_ & 0xffffffffffffff00;
  local_4f0._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_4e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1148 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_4e0._8_8_ = (allocator<char> *)local_550;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_510,(lazy_ostream *)local_4f0,1,0,WARN,(check_type)pcVar13,
             (size_t)&local_1150,0x20b);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_500._M_allocated_capacity);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_530);
  std::__cxx11::string::~string((string *)local_410);
  local_1160 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1158 = "";
  local_1170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1168 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_54.m_end = pvVar9;
  msg_54.m_begin = pvVar8;
  file_54.m_end = (iterator)0x20c;
  file_54.m_begin = (iterator)&local_1160;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_54,(size_t)&local_1170,
             msg_54);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-noh",(allocator<char> *)&local_11b8);
  ArgsManager::GetArgs
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_530,&test_args.super_ArgsManager,(string *)local_410);
  local_510[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((pointer)local_530._M_string_length == local_530._M_dataplus._M_p);
  local_510._8_8_ = (element_type *)0x0;
  aStack_500._M_allocated_capacity = 0;
  local_550._0_8_ = "test_args.GetArgs(\"-noh\").size() == 0";
  local_550._8_8_ = "";
  local_4f0._8_8_ = local_4f0._8_8_ & 0xffffffffffffff00;
  local_4f0._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_4e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1178 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_4e0._8_8_ = (allocator<char> *)local_550;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_510,(lazy_ostream *)local_4f0,1,0,WARN,(check_type)pcVar13,
             (size_t)&local_1180,0x20c);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_500._M_allocated_capacity);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_530);
  std::__cxx11::string::~string((string *)local_410);
  local_1190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1188 = "";
  local_11a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1198 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_55.m_end = pvVar9;
  msg_55.m_begin = pvVar8;
  file_55.m_end = (iterator)0x20e;
  file_55.m_begin = (iterator)&local_1190;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_55,(size_t)&local_11a0,
             msg_55);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-i",(allocator<char> *)&local_15c0);
  ArgsManager::GetArgs
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_550,&test_args.super_ArgsManager,(string *)local_410);
  lVar10 = local_550._8_8_ - local_550._0_8_;
  if (lVar10 == 0x20) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_4f0,"-i",&local_11b9);
    ArgsManager::GetArgs(&local_11b8,&test_args.super_ArgsManager,(string *)local_4f0);
    bVar3 = std::operator==(local_11b8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,"1");
  }
  else {
    bVar3 = false;
  }
  local_530._M_dataplus._M_p._0_1_ = bVar3;
  local_530._M_string_length = 0;
  local_530.field_2._M_allocated_capacity = 0;
  sec1_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1bef88;
  sec1_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xb53a2c;
  local_510._8_8_ = local_510._8_8_ & 0xffffffffffffff00;
  local_510._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_500._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_11d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_11c8 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_500._8_8_ = &sec1_ccc_expected;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_530,(lazy_ostream *)local_510,1,0,WARN,(check_type)pcVar13,
             (size_t)&local_11d0,0x20e);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_530.field_2._M_allocated_capacity);
  if (lVar10 == 0x20) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_11b8);
    std::__cxx11::string::~string((string *)local_4f0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_550);
  std::__cxx11::string::~string((string *)local_410);
  local_11e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_11d8 = "";
  local_11f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_11e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_56.m_end = pvVar9;
  msg_56.m_begin = pvVar8;
  file_56.m_end = (iterator)0x20f;
  file_56.m_begin = (iterator)&local_11e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_56,(size_t)&local_11f0,
             msg_56);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-noi",(allocator<char> *)&local_15c0);
  ArgsManager::GetArgs
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_550,&test_args.super_ArgsManager,(string *)local_410);
  local_530._M_string_length = 0;
  local_530.field_2._M_allocated_capacity = 0;
  sec1_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1befa2;
  sec1_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xb53a57;
  local_510._8_8_ = local_510._8_8_ & 0xffffffffffffff00;
  local_510._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_500._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_11f8 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_500._8_8_ = &sec1_ccc_expected;
  local_530._M_dataplus._M_p._0_1_ = local_550._8_8_ == local_550._0_8_;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_530,(lazy_ostream *)local_510,1,0,WARN,(check_type)pcVar13,
             (size_t)&local_1200,0x20f);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_530.field_2._M_allocated_capacity);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_550);
  std::__cxx11::string::~string((string *)local_410);
  local_1210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1208 = "";
  local_1220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1218 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_57.m_end = pvVar9;
  msg_57.m_begin = pvVar8;
  file_57.m_end = (iterator)0x210;
  file_57.m_begin = (iterator)&local_1210;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_57,(size_t)&local_1220,
             msg_57);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-zzz",(allocator<char> *)&local_15c0);
  ArgsManager::GetArgs
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_550,&test_args.super_ArgsManager,(string *)local_410);
  local_530._M_dataplus._M_p._0_1_ = local_550._8_8_ == local_550._0_8_;
  local_530._M_string_length = 0;
  local_530.field_2._M_allocated_capacity = 0;
  sec1_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1befaf;
  sec1_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xb53a7d;
  local_510._8_8_ = local_510._8_8_ & 0xffffffffffffff00;
  local_510._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_500._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1228 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_500._8_8_ = &sec1_ccc_expected;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_530,(lazy_ostream *)local_510,1,0,WARN,(check_type)pcVar13,
             (size_t)&local_1230,0x210);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_530.field_2._M_allocated_capacity);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_550);
  std::__cxx11::string::~string((string *)local_410);
  local_1240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1238 = "";
  local_1250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1248 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_58.m_end = pvVar9;
  msg_58.m_begin = pvVar8;
  file_58.m_end = (iterator)0x212;
  file_58.m_begin = (iterator)&local_1240;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_58,(size_t)&local_1250,
             msg_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-a",(allocator<char> *)&sec1_ccc_expected);
  bVar3 = ArgsManager::IsArgNegated(&test_args.super_ArgsManager,(string *)local_410);
  local_530._M_dataplus._M_p._0_1_ = !bVar3;
  local_530._M_string_length = 0;
  local_530.field_2._M_allocated_capacity = 0;
  local_550._0_8_ = "!test_args.IsArgNegated(\"-a\")";
  local_550._8_8_ = "";
  local_510._8_8_ = local_510._8_8_ & 0xffffffffffffff00;
  local_510._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_500._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1258 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_500._8_8_ =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)local_550;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_530,(lazy_ostream *)local_510,1,0,WARN,(check_type)pcVar13,
             (size_t)&local_1260,0x212);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_530.field_2._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_410);
  local_1270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1268 = "";
  local_1280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1278 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_59.m_end = pvVar9;
  msg_59.m_begin = pvVar8;
  file_59.m_end = (iterator)0x213;
  file_59.m_begin = (iterator)&local_1270;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_59,(size_t)&local_1280,
             msg_59);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-b",(allocator<char> *)&sec1_ccc_expected);
  bVar3 = ArgsManager::IsArgNegated(&test_args.super_ArgsManager,(string *)local_410);
  local_530._M_dataplus._M_p._0_1_ = !bVar3;
  local_530._M_string_length = 0;
  local_530.field_2._M_allocated_capacity = 0;
  local_550._0_8_ = "!test_args.IsArgNegated(\"-b\")";
  local_550._8_8_ = "";
  local_510._8_8_ = local_510._8_8_ & 0xffffffffffffff00;
  local_510._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_500._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1288 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_500._8_8_ =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)local_550;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_530,(lazy_ostream *)local_510,1,0,WARN,(check_type)pcVar13,
             (size_t)&local_1290,0x213);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_530.field_2._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_410);
  local_12a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1298 = "";
  local_12b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_12a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_60.m_end = pvVar9;
  msg_60.m_begin = pvVar8;
  file_60.m_end = (iterator)0x214;
  file_60.m_begin = (iterator)&local_12a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_60,(size_t)&local_12b0,
             msg_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-ccc",(allocator<char> *)&sec1_ccc_expected);
  bVar3 = ArgsManager::IsArgNegated(&test_args.super_ArgsManager,(string *)local_410);
  local_530._M_dataplus._M_p._0_1_ = !bVar3;
  local_530._M_string_length = 0;
  local_530.field_2._M_allocated_capacity = 0;
  local_550._0_8_ = "!test_args.IsArgNegated(\"-ccc\")";
  local_550._8_8_ = "";
  local_510._8_8_ = local_510._8_8_ & 0xffffffffffffff00;
  local_510._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_500._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_12c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_12b8 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_500._8_8_ =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)local_550;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_530,(lazy_ostream *)local_510,1,0,WARN,(check_type)pcVar13,
             (size_t)&local_12c0,0x214);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_530.field_2._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_410);
  local_12d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_12c8 = "";
  local_12e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_12d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_61.m_end = pvVar9;
  msg_61.m_begin = pvVar8;
  file_61.m_end = (iterator)0x215;
  file_61.m_begin = (iterator)&local_12d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_61,(size_t)&local_12e0,
             msg_61);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-d",(allocator<char> *)&sec1_ccc_expected);
  bVar3 = ArgsManager::IsArgNegated(&test_args.super_ArgsManager,(string *)local_410);
  local_530._M_dataplus._M_p._0_1_ = !bVar3;
  local_530._M_string_length = 0;
  local_530.field_2._M_allocated_capacity = 0;
  local_550._0_8_ = "!test_args.IsArgNegated(\"-d\")";
  local_550._8_8_ = "";
  local_510._8_8_ = local_510._8_8_ & 0xffffffffffffff00;
  local_510._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_500._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_12f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_12e8 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_500._8_8_ =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)local_550;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_530,(lazy_ostream *)local_510,1,0,WARN,(check_type)pcVar13,
             (size_t)&local_12f0,0x215);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_530.field_2._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_410);
  local_1300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_12f8 = "";
  local_1310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1308 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_62.m_end = pvVar9;
  msg_62.m_begin = pvVar8;
  file_62.m_end = (iterator)0x216;
  file_62.m_begin = (iterator)&local_1300;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_62,(size_t)&local_1310,
             msg_62);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-fff",(allocator<char> *)&sec1_ccc_expected);
  local_530._M_dataplus._M_p._0_1_ =
       ArgsManager::IsArgNegated(&test_args.super_ArgsManager,(string *)local_410);
  local_530._M_string_length = 0;
  local_530.field_2._M_allocated_capacity = 0;
  local_550._0_8_ = "test_args.IsArgNegated(\"-fff\")";
  local_550._8_8_ = "";
  local_510._8_8_ = local_510._8_8_ & 0xffffffffffffff00;
  local_510._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_500._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1320 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1318 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_500._8_8_ =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)local_550;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_530,(lazy_ostream *)local_510,1,0,WARN,(check_type)pcVar13,
             (size_t)&local_1320,0x216);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_530.field_2._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_410);
  local_1330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1328 = "";
  local_1340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1338 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_63.m_end = pvVar9;
  msg_63.m_begin = pvVar8;
  file_63.m_end = (iterator)0x217;
  file_63.m_begin = (iterator)&local_1330;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_63,(size_t)&local_1340,
             msg_63);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-ggg",(allocator<char> *)&sec1_ccc_expected);
  bVar3 = ArgsManager::IsArgNegated(&test_args.super_ArgsManager,(string *)local_410);
  local_530._M_dataplus._M_p._0_1_ = !bVar3;
  local_530._M_string_length = 0;
  local_530.field_2._M_allocated_capacity = 0;
  local_550._0_8_ = "!test_args.IsArgNegated(\"-ggg\")";
  local_550._8_8_ = "";
  local_510._8_8_ = local_510._8_8_ & 0xffffffffffffff00;
  local_510._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_500._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1350 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1348 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_500._8_8_ =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)local_550;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_530,(lazy_ostream *)local_510,1,0,WARN,(check_type)pcVar13,
             (size_t)&local_1350,0x217);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_530.field_2._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_410);
  local_1360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1358 = "";
  local_1370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1368 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_64.m_end = pvVar9;
  msg_64.m_begin = pvVar8;
  file_64.m_end = (iterator)0x218;
  file_64.m_begin = (iterator)&local_1360;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_64,(size_t)&local_1370,
             msg_64);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-h",(allocator<char> *)&sec1_ccc_expected);
  local_530._M_dataplus._M_p._0_1_ =
       ArgsManager::IsArgNegated(&test_args.super_ArgsManager,(string *)local_410);
  local_530._M_string_length = 0;
  local_530.field_2._M_allocated_capacity = 0;
  local_550._0_8_ = "test_args.IsArgNegated(\"-h\")";
  local_550._8_8_ = "";
  local_510._8_8_ = local_510._8_8_ & 0xffffffffffffff00;
  local_510._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_500._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1380 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1378 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_500._8_8_ =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)local_550;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_530,(lazy_ostream *)local_510,1,0,WARN,(check_type)pcVar13,
             (size_t)&local_1380,0x218);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_530.field_2._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_410);
  local_1390 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1388 = "";
  local_13a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1398 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_65.m_end = pvVar9;
  msg_65.m_begin = pvVar8;
  file_65.m_end = (iterator)0x219;
  file_65.m_begin = (iterator)&local_1390;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_65,(size_t)&local_13a0,
             msg_65);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-i",(allocator<char> *)&sec1_ccc_expected);
  bVar3 = ArgsManager::IsArgNegated(&test_args.super_ArgsManager,(string *)local_410);
  local_530._M_dataplus._M_p._0_1_ = !bVar3;
  local_530._M_string_length = 0;
  local_530.field_2._M_allocated_capacity = 0;
  local_550._0_8_ = "!test_args.IsArgNegated(\"-i\")";
  local_550._8_8_ = "";
  local_510._8_8_ = local_510._8_8_ & 0xffffffffffffff00;
  local_510._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_500._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_13b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_13a8 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_500._8_8_ =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)local_550;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_530,(lazy_ostream *)local_510,1,0,WARN,(check_type)pcVar13,
             (size_t)&local_13b0,0x219);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_530.field_2._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_410);
  local_13c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_13b8 = "";
  local_13d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_13c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_66.m_end = pvVar9;
  msg_66.m_begin = pvVar8;
  file_66.m_end = (iterator)0x21a;
  file_66.m_begin = (iterator)&local_13c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_66,(size_t)&local_13d0,
             msg_66);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-zzz",(allocator<char> *)&sec1_ccc_expected);
  bVar3 = ArgsManager::IsArgNegated(&test_args.super_ArgsManager,(string *)local_410);
  local_530._M_dataplus._M_p._0_1_ = !bVar3;
  local_530._M_string_length = 0;
  local_530.field_2._M_allocated_capacity = 0;
  local_550._0_8_ = "!test_args.IsArgNegated(\"-zzz\")";
  local_550._8_8_ = "";
  local_510._8_8_ = local_510._8_8_ & 0xffffffffffffff00;
  local_510._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_500._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_13e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_13d8 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_500._8_8_ =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)local_550;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_530,(lazy_ostream *)local_510,1,0,WARN,(check_type)pcVar13,
             (size_t)&local_13e0,0x21a);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_530.field_2._M_allocated_capacity);
  std::__cxx11::string::~string((string *)local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"sec1",(allocator<char> *)local_510);
  ArgsManager::SelectConfigNetwork(&test_args.super_ArgsManager,(string *)local_410);
  std::__cxx11::string::~string((string *)local_410);
  local_13f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_13e8 = "";
  local_1400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_13f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_67.m_end = pvVar9;
  msg_67.m_begin = pvVar8;
  file_67.m_end = (iterator)0x220;
  file_67.m_begin = (iterator)&local_13f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_67,(size_t)&local_1400,
             msg_67);
  local_410[8] = false;
  local_410._0_8_ = &PTR__lazy_ostream_01139f30;
  local_400 = boost::unit_test::lazy_ostream::inst;
  local_3f8 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1410 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1408 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"-a",(allocator<char> *)&sec1_ccc_expected);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_550,"xxx",(allocator<char> *)&local_15c0);
  ArgsManager::GetArg((string *)local_510,&test_args.super_ArgsManager,&local_530,
                      (string *)local_550);
  pvVar9 = (iterator)0x2;
  pvVar8 = local_510;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (local_410,&local_1410,0x220,1,2,pvVar8,0xb53502,"","\"\"");
  std::__cxx11::string::~string((string *)local_510);
  std::__cxx11::string::~string((string *)local_550);
  std::__cxx11::string::~string((string *)&local_530);
  local_1420 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1418 = "";
  local_1430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1428 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_68.m_end = pvVar8;
  msg_68.m_begin = pvVar9;
  file_68.m_end = (iterator)0x221;
  file_68.m_begin = (iterator)&local_1420;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_68,(size_t)&local_1430,
             msg_68);
  local_410[8] = false;
  local_410._0_8_ = &PTR__lazy_ostream_01139f30;
  local_400 = boost::unit_test::lazy_ostream::inst;
  local_3f8 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1440 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1438 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"-b",(allocator<char> *)&sec1_ccc_expected);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_550,"xxx",(allocator<char> *)&local_15c0);
  ArgsManager::GetArg((string *)local_510,&test_args.super_ArgsManager,&local_530,
                      (string *)local_550);
  pvVar9 = (iterator)0x2;
  pvVar8 = local_510;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
            (local_410,&local_1440,0x221,1,2,pvVar8,0xb53520,"1","\"1\"");
  std::__cxx11::string::~string((string *)local_510);
  std::__cxx11::string::~string((string *)local_550);
  std::__cxx11::string::~string((string *)&local_530);
  local_1450 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1448 = "";
  local_1460 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1458 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_69.m_end = pvVar8;
  msg_69.m_begin = pvVar9;
  file_69.m_end = (iterator)0x222;
  file_69.m_begin = (iterator)&local_1450;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_69,(size_t)&local_1460,
             msg_69);
  local_410[8] = false;
  local_410._0_8_ = &PTR__lazy_ostream_01139f30;
  local_400 = boost::unit_test::lazy_ostream::inst;
  local_3f8 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1470 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1468 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"-fff",(allocator<char> *)&sec1_ccc_expected);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_550,"xxx",(allocator<char> *)&local_15c0);
  ArgsManager::GetArg((string *)local_510,&test_args.super_ArgsManager,&local_530,
                      (string *)local_550);
  pvVar9 = (iterator)0x2;
  pvVar8 = local_510;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
            (local_410,&local_1470,0x222,1,2,pvVar8,0xb5357c,"0","\"0\"");
  std::__cxx11::string::~string((string *)local_510);
  std::__cxx11::string::~string((string *)local_550);
  std::__cxx11::string::~string((string *)&local_530);
  local_1480 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1478 = "";
  local_1490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1488 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_70.m_end = pvVar8;
  msg_70.m_begin = pvVar9;
  file_70.m_end = (iterator)0x223;
  file_70.m_begin = (iterator)&local_1480;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_70,(size_t)&local_1490,
             msg_70);
  local_410[8] = false;
  local_410._0_8_ = &PTR__lazy_ostream_01139f30;
  local_400 = boost::unit_test::lazy_ostream::inst;
  local_3f8 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_14a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1498 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"-ggg",(allocator<char> *)&sec1_ccc_expected);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_550,"xxx",(allocator<char> *)&local_15c0);
  ArgsManager::GetArg((string *)local_510,&test_args.super_ArgsManager,&local_530,
                      (string *)local_550);
  pvVar9 = (iterator)0x2;
  pvVar8 = local_510;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
            (local_410,&local_14a0,0x223,1,2,pvVar8,0xb5359c,"1","\"1\"");
  std::__cxx11::string::~string((string *)local_510);
  std::__cxx11::string::~string((string *)local_550);
  std::__cxx11::string::~string((string *)&local_530);
  local_14b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_14a8 = "";
  local_14c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_14b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_71.m_end = pvVar8;
  msg_71.m_begin = pvVar9;
  file_71.m_end = (iterator)0x224;
  file_71.m_begin = (iterator)&local_14b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_71,(size_t)&local_14c0,
             msg_71);
  local_410[8] = false;
  local_410._0_8_ = &PTR__lazy_ostream_01139f30;
  local_400 = boost::unit_test::lazy_ostream::inst;
  local_3f8 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_14d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_14c8 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"-zzz",(allocator<char> *)&sec1_ccc_expected);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_550,"xxx",(allocator<char> *)&local_15c0);
  ArgsManager::GetArg((string *)local_510,&test_args.super_ArgsManager,&local_530,
                      (string *)local_550);
  pvVar9 = (iterator)0x2;
  pvVar8 = local_510;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
            (local_410,&local_14d0,0x224,1,2,pvVar8,0xb535f8,"xxx","\"xxx\"");
  std::__cxx11::string::~string((string *)local_510);
  std::__cxx11::string::~string((string *)local_550);
  std::__cxx11::string::~string((string *)&local_530);
  local_14e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_14d8 = "";
  local_14f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_14e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_72.m_end = pvVar8;
  msg_72.m_begin = pvVar9;
  file_72.m_end = (iterator)0x225;
  file_72.m_begin = (iterator)&local_14e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_72,(size_t)&local_14f0,
             msg_72);
  local_410[8] = false;
  local_410._0_8_ = &PTR__lazy_ostream_01139f30;
  local_400 = boost::unit_test::lazy_ostream::inst;
  local_3f8 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1500 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_14f8 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"-iii",(allocator<char> *)&sec1_ccc_expected);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_550,"xxx",(allocator<char> *)&local_15c0);
  ArgsManager::GetArg((string *)local_510,&test_args.super_ArgsManager,&local_530,
                      (string *)local_550);
  pcVar13 = "xxx";
  pvVar9 = (iterator)0x2;
  pvVar8 = local_510;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
            (local_410,&local_1500,0x225,1,2,pvVar8,0xb53618,"xxx","\"xxx\"");
  std::__cxx11::string::~string((string *)local_510);
  std::__cxx11::string::~string((string *)local_550);
  std::__cxx11::string::~string((string *)&local_530);
  local_1510 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1508 = "";
  local_1520 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1518 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_73.m_end = pvVar8;
  msg_73.m_begin = pvVar9;
  file_73.m_end = (iterator)0x227;
  file_73.m_begin = (iterator)&local_1510;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_73,(size_t)&local_1520,
             msg_73);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_510,"-d",(allocator<char> *)&sec2_ccc_expected);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"xxx",(allocator<char> *)&local_17d0);
  ArgsManager::GetArg((string *)local_410,&test_args.super_ArgsManager,(string *)local_510,
                      &local_530);
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_410,"eee");
  sec1_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(sec1_ccc_expected.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar3);
  sec1_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sec1_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_15c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xb53b96;
  local_15c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xb53bbc;
  local_550._8_8_ = local_550._8_8_ & 0xffffffffffffff00;
  local_550._0_8_ = &PTR__lazy_ostream_0113a070;
  local_550._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1548 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1540 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_550._24_8_ = (allocator<char> *)&local_15c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&sec1_ccc_expected,(lazy_ostream *)local_550,1,0,WARN,
             (check_type)pcVar13,(size_t)&local_1548,0x227);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &sec1_ccc_expected.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_410);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)local_510);
  local_1558 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1550 = "";
  local_1568 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1560 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_74.m_end = pvVar9;
  msg_74.m_begin = pvVar8;
  file_74.m_end = (iterator)0x229;
  file_74.m_begin = (iterator)&local_1558;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_74,(size_t)&local_1568,
             msg_74);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_510,"-h",(allocator<char> *)&sec2_ccc_expected);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"xxx",(allocator<char> *)&local_17d0);
  ArgsManager::GetArg((string *)local_410,&test_args.super_ArgsManager,(string *)local_510,
                      &local_530);
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_410,"1");
  sec1_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(sec1_ccc_expected.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar3);
  sec1_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sec1_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_15c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xb53bbd;
  local_15c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xb53be1;
  local_550._8_8_ = local_550._8_8_ & 0xffffffffffffff00;
  local_550._0_8_ = &PTR__lazy_ostream_0113a070;
  local_550._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1578 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1570 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_550._24_8_ = (allocator<char> *)&local_15c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&sec1_ccc_expected,(lazy_ostream *)local_550,1,0,WARN,
             (check_type)pcVar13,(size_t)&local_1578,0x229);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &sec1_ccc_expected.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_410);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)local_510);
  local_1588 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1580 = "";
  local_1598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1590 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_75.m_end = pvVar9;
  msg_75.m_begin = pvVar8;
  file_75.m_end = (iterator)0x22b;
  file_75.m_begin = (iterator)&local_1588;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_75,(size_t)&local_1598,
             msg_75);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_510,"-ccc",(allocator<char> *)&sec2_ccc_expected);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"xxx",(allocator<char> *)&local_17d0);
  ArgsManager::GetArg((string *)local_410,&test_args.super_ArgsManager,(string *)local_510,
                      &local_530);
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_410,"extend1");
  sec1_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(sec1_ccc_expected.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar3);
  sec1_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sec1_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_15c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xb53bea;
  local_15c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xb53c16;
  local_550._8_8_ = local_550._8_8_ & 0xffffffffffffff00;
  local_550._0_8_ = &PTR__lazy_ostream_0113a070;
  local_550._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_15a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_15a0 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_550._24_8_ = (allocator<char> *)&local_15c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&sec1_ccc_expected,(lazy_ostream *)local_550,1,0,WARN,
             (check_type)pcVar13,(size_t)&local_15a8,0x22b);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &sec1_ccc_expected.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_410);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)local_510);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"extend1",(allocator<char> *)local_510);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3f0,"extend2",(allocator<char> *)&local_530);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_3e8 + 0x18),"argument",(allocator<char> *)local_550);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_3c0 + 0x10),"multiple",(allocator<char> *)&local_15c0);
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)local_410;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&sec1_ccc_expected,__l_00,(allocator_type *)&sec2_ccc_expected);
  lVar10 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(local_410 + lVar10));
    lVar10 = lVar10 + -0x20;
  } while (lVar10 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-ccc",(allocator<char> *)local_510);
  ArgsManager::GetArgs(&local_15c0,&test_args.super_ArgsManager,(string *)local_410);
  std::__cxx11::string::~string((string *)local_410);
  local_15d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_15c8 = "";
  local_15e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_15d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_76.m_end = pvVar9;
  msg_76.m_begin = pvVar8;
  file_76.m_end = (iterator)0x22f;
  file_76.m_begin = (iterator)&local_15d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_76,(size_t)&local_15e0,
             msg_76);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            ((assertion_result *)local_510,(equal_coll_impl *)&local_530,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_15c0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_15c0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )sec1_ccc_expected.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )sec1_ccc_expected.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  local_410[8] = false;
  local_410._0_8_ = &PTR__lazy_ostream_01139f30;
  local_400 = boost::unit_test::lazy_ostream::inst;
  local_3f8 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_15f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_15e8 = "";
  pcVar13 = "sec1_ccc_res.begin()";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0xd;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_510,(lazy_ostream *)local_410,1,0xd,4,0xb53c1f,
             (size_t)&local_15f0,0x22f,"sec1_ccc_res.end()","sec1_ccc_expected.begin()",
             "sec1_ccc_expected.end()");
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_500._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"sec2",(allocator<char> *)local_510);
  ArgsManager::SelectConfigNetwork(&test_args.super_ArgsManager,(string *)local_410);
  std::__cxx11::string::~string((string *)local_410);
  local_1600 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_15f8 = "";
  local_1610 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1608 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_77.m_end = pvVar9;
  msg_77.m_begin = pvVar8;
  file_77.m_end = (iterator)0x234;
  file_77.m_begin = (iterator)&local_1600;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_77,(size_t)&local_1610,
             msg_77);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_510,"-a",(allocator<char> *)&local_1838);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"xxx",(allocator<char> *)&local_1850);
  ArgsManager::GetArg((string *)local_410,&test_args.super_ArgsManager,(string *)local_510,
                      &local_530);
  sec2_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ =
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_410,"");
  sec2_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sec2_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_17d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xb53c79;
  local_17d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xb53c9c;
  local_550._8_8_ = local_550._8_8_ & 0xffffffffffffff00;
  local_550._0_8_ = &PTR__lazy_ostream_0113a070;
  local_550._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1638 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1630 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_550._24_8_ = (allocator<char> *)&local_17d0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&sec2_ccc_expected,(lazy_ostream *)local_550,1,0,WARN,
             (check_type)pcVar13,(size_t)&local_1638,0x234);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &sec2_ccc_expected.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_410);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)local_510);
  local_1648 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1640 = "";
  local_1658 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1650 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_78.m_end = pvVar9;
  msg_78.m_begin = pvVar8;
  file_78.m_end = (iterator)0x235;
  file_78.m_begin = (iterator)&local_1648;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_78,(size_t)&local_1658,
             msg_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_510,"-b",(allocator<char> *)&local_1838);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"xxx",(allocator<char> *)&local_1850);
  ArgsManager::GetArg((string *)local_410,&test_args.super_ArgsManager,(string *)local_510,
                      &local_530);
  sec2_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ =
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_410,"1");
  sec2_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sec2_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_17d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xb53c9d;
  local_17d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xb53cc1;
  local_550._8_8_ = local_550._8_8_ & 0xffffffffffffff00;
  local_550._0_8_ = &PTR__lazy_ostream_0113a070;
  local_550._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1668 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1660 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_550._24_8_ = (allocator<char> *)&local_17d0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&sec2_ccc_expected,(lazy_ostream *)local_550,1,0,WARN,
             (check_type)pcVar13,(size_t)&local_1668,0x235);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &sec2_ccc_expected.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_410);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)local_510);
  local_1678 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1670 = "";
  local_1688 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1680 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_79.m_end = pvVar9;
  msg_79.m_begin = pvVar8;
  file_79.m_end = (iterator)0x236;
  file_79.m_begin = (iterator)&local_1678;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_79,(size_t)&local_1688,
             msg_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_510,"-d",(allocator<char> *)&local_1838);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"xxx",(allocator<char> *)&local_1850);
  ArgsManager::GetArg((string *)local_410,&test_args.super_ArgsManager,(string *)local_510,
                      &local_530);
  sec2_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ =
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_410,"e");
  sec2_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sec2_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_17d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xb53cc2;
  local_17d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xb53ce6;
  local_550._8_8_ = local_550._8_8_ & 0xffffffffffffff00;
  local_550._0_8_ = &PTR__lazy_ostream_0113a070;
  local_550._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1698 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1690 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_550._24_8_ = (allocator<char> *)&local_17d0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&sec2_ccc_expected,(lazy_ostream *)local_550,1,0,WARN,
             (check_type)pcVar13,(size_t)&local_1698,0x236);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &sec2_ccc_expected.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_410);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)local_510);
  local_16a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_16a0 = "";
  local_16b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_16b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_80.m_end = pvVar9;
  msg_80.m_begin = pvVar8;
  file_80.m_end = (iterator)0x237;
  file_80.m_begin = (iterator)&local_16a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_80,(size_t)&local_16b8,
             msg_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_510,"-fff",(allocator<char> *)&local_1838);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"xxx",(allocator<char> *)&local_1850);
  ArgsManager::GetArg((string *)local_410,&test_args.super_ArgsManager,(string *)local_510,
                      &local_530);
  sec2_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ =
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_410,"0");
  sec2_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sec2_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_17d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xb53ce7;
  local_17d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xb53d0d;
  local_550._8_8_ = local_550._8_8_ & 0xffffffffffffff00;
  local_550._0_8_ = &PTR__lazy_ostream_0113a070;
  local_550._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_16c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_16c0 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_550._24_8_ = (allocator<char> *)&local_17d0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&sec2_ccc_expected,(lazy_ostream *)local_550,1,0,WARN,
             (check_type)pcVar13,(size_t)&local_16c8,0x237);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &sec2_ccc_expected.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_410);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)local_510);
  local_16d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_16d0 = "";
  local_16e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_16e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_81.m_end = pvVar9;
  msg_81.m_begin = pvVar8;
  file_81.m_end = (iterator)0x238;
  file_81.m_begin = (iterator)&local_16d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_81,(size_t)&local_16e8,
             msg_81);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_510,"-ggg",(allocator<char> *)&local_1838);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"xxx",(allocator<char> *)&local_1850);
  ArgsManager::GetArg((string *)local_410,&test_args.super_ArgsManager,(string *)local_510,
                      &local_530);
  sec2_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ =
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_410,"1");
  sec2_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sec2_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_17d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xb53d0e;
  local_17d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xb53d34;
  local_550._8_8_ = local_550._8_8_ & 0xffffffffffffff00;
  local_550._0_8_ = &PTR__lazy_ostream_0113a070;
  local_550._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_16f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_16f0 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_550._24_8_ = (allocator<char> *)&local_17d0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&sec2_ccc_expected,(lazy_ostream *)local_550,1,0,WARN,
             (check_type)pcVar13,(size_t)&local_16f8,0x238);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &sec2_ccc_expected.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_410);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)local_510);
  local_1708 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1700 = "";
  local_1718 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1710 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_82.m_end = pvVar9;
  msg_82.m_begin = pvVar8;
  file_82.m_end = (iterator)0x239;
  file_82.m_begin = (iterator)&local_1708;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_82,(size_t)&local_1718,
             msg_82);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_510,"-zzz",(allocator<char> *)&local_1838);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"xxx",(allocator<char> *)&local_1850);
  ArgsManager::GetArg((string *)local_410,&test_args.super_ArgsManager,(string *)local_510,
                      &local_530);
  sec2_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ =
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_410,"xxx");
  sec2_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sec2_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_17d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xb53d35;
  local_17d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xb53d5d;
  local_550._8_8_ = local_550._8_8_ & 0xffffffffffffff00;
  local_550._0_8_ = &PTR__lazy_ostream_0113a070;
  local_550._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1728 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1720 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_550._24_8_ = (allocator<char> *)&local_17d0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&sec2_ccc_expected,(lazy_ostream *)local_550,1,0,WARN,
             (check_type)pcVar13,(size_t)&local_1728,0x239);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &sec2_ccc_expected.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_410);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)local_510);
  local_1738 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1730 = "";
  local_1748 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1740 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_83.m_end = pvVar9;
  msg_83.m_begin = pvVar8;
  file_83.m_end = (iterator)0x23a;
  file_83.m_begin = (iterator)&local_1738;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_83,(size_t)&local_1748,
             msg_83);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_510,"-h",(allocator<char> *)&local_1838);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"xxx",(allocator<char> *)&local_1850);
  ArgsManager::GetArg((string *)local_410,&test_args.super_ArgsManager,(string *)local_510,
                      &local_530);
  sec2_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ =
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_410,"0");
  sec2_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sec2_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_17d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xb53d5e;
  local_17d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xb53d82;
  local_550._8_8_ = local_550._8_8_ & 0xffffffffffffff00;
  local_550._0_8_ = &PTR__lazy_ostream_0113a070;
  local_550._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1758 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1750 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_550._24_8_ = (allocator<char> *)&local_17d0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&sec2_ccc_expected,(lazy_ostream *)local_550,1,0,WARN,
             (check_type)pcVar13,(size_t)&local_1758,0x23a);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &sec2_ccc_expected.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_410);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)local_510);
  local_1768 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1760 = "";
  local_1778 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1770 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_84.m_end = pvVar9;
  msg_84.m_begin = pvVar8;
  file_84.m_end = (iterator)0x23c;
  file_84.m_begin = (iterator)&local_1768;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_84,(size_t)&local_1778,
             msg_84);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_510,"-iii",(allocator<char> *)&local_1838);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"xxx",(allocator<char> *)&local_1850);
  ArgsManager::GetArg((string *)local_410,&test_args.super_ArgsManager,(string *)local_510,
                      &local_530);
  sec2_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ =
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_410,"2");
  sec2_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sec2_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_17d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xb53d83;
  local_17d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xb53da9;
  local_550._8_8_ = local_550._8_8_ & 0xffffffffffffff00;
  local_550._0_8_ = &PTR__lazy_ostream_0113a070;
  local_550._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1788 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1780 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_550._24_8_ = (allocator<char> *)&local_17d0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&sec2_ccc_expected,(lazy_ostream *)local_550,1,0,WARN,
             (check_type)pcVar13,(size_t)&local_1788,0x23c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &sec2_ccc_expected.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_410);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)local_510);
  local_1798 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1790 = "";
  local_17a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_17a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_85.m_end = pvVar9;
  msg_85.m_begin = pvVar8;
  file_85.m_end = (iterator)0x23e;
  file_85.m_begin = (iterator)&local_1798;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_85,(size_t)&local_17a8,
             msg_85);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_510,"-ccc",(allocator<char> *)&local_1838);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"xxx",(allocator<char> *)&local_1850);
  ArgsManager::GetArg((string *)local_410,&test_args.super_ArgsManager,(string *)local_510,
                      &local_530);
  sec2_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ =
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_410,"extend3");
  sec2_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sec2_ccc_expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_17d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xb53db2;
  local_17d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xb53dde;
  local_550._8_8_ = local_550._8_8_ & 0xffffffffffffff00;
  local_550._0_8_ = &PTR__lazy_ostream_0113a070;
  local_550._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_17b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_17b0 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_550._24_8_ = (allocator<char> *)&local_17d0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&sec2_ccc_expected,(lazy_ostream *)local_550,1,0,WARN,
             (check_type)pcVar13,(size_t)&local_17b8,0x23e);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &sec2_ccc_expected.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_410);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)local_510);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"extend3",(allocator<char> *)local_510);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3f0,"argument",(allocator<char> *)&local_530);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_3e8 + 0x18),"multiple",(allocator<char> *)local_550);
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)local_410;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&sec2_ccc_expected,__l_01,(allocator_type *)&local_17d0);
  lVar10 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_410 + lVar10));
    lVar10 = lVar10 + -0x20;
  } while (lVar10 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-ccc",(allocator<char> *)local_510);
  ArgsManager::GetArgs(&local_17d0,&test_args.super_ArgsManager,(string *)local_410);
  std::__cxx11::string::~string((string *)local_410);
  local_17e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_17d8 = "";
  local_17f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_17e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_86.m_end = pvVar9;
  msg_86.m_begin = pvVar8;
  file_86.m_end = (iterator)0x242;
  file_86.m_begin = (iterator)&local_17e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_86,(size_t)&local_17f0,
             msg_86);
  right_begin._M_current._1_7_ =
       sec2_ccc_expected.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._1_7_;
  right_begin._M_current._0_1_ =
       sec2_ccc_expected.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._0_1_;
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            ((assertion_result *)local_510,(equal_coll_impl *)&local_530,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_17d0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_17d0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,right_begin,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )sec2_ccc_expected.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  local_410[8] = false;
  local_410._0_8_ = &PTR__lazy_ostream_01139f30;
  local_400 = boost::unit_test::lazy_ostream::inst;
  local_3f8 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1800 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_17f8 = "";
  pcVar15 = "sec2_ccc_expected.begin()";
  pcVar14 = "sec2_ccc_res.end()";
  pcVar13 = "sec2_ccc_res.begin()";
  uVar11 = 4;
  uVar12 = 0;
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0xd;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_510,(lazy_ostream *)local_410,1,0xd,4,0xb53ddf,
             (size_t)&local_1800,0x242,"sec2_ccc_res.end()","sec2_ccc_expected.begin()",
             "sec2_ccc_expected.end()");
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_500._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>(local_570,"-d",(allocator<char> *)local_410);
  arg._M_dataplus._M_p._4_4_ = uVar12;
  arg._M_dataplus._M_p._0_4_ = uVar11;
  arg._M_string_length = (size_type)pcVar13;
  arg.field_2._M_allocated_capacity = (size_type)pcVar14;
  arg.field_2._8_8_ = pcVar15;
  TestArgsManager::SetNetworkOnlyArg(&test_args,arg);
  std::__cxx11::string::~string(local_570);
  std::__cxx11::string::string<std::allocator<char>>(local_590,"-ccc",(allocator<char> *)local_410);
  arg_00._M_dataplus._M_p._4_4_ = uVar12;
  arg_00._M_dataplus._M_p._0_4_ = uVar11;
  arg_00._M_string_length = (size_type)pcVar13;
  arg_00.field_2._M_allocated_capacity = (size_type)pcVar14;
  arg_00.field_2._8_8_ = pcVar15;
  TestArgsManager::SetNetworkOnlyArg(&test_args,arg_00);
  std::__cxx11::string::~string(local_590);
  std::__cxx11::string::string<std::allocator<char>>(local_5b0,"-h",(allocator<char> *)local_410);
  arg_01._M_dataplus._M_p._4_4_ = uVar12;
  arg_01._M_dataplus._M_p._0_4_ = uVar11;
  arg_01._M_string_length = (size_type)pcVar13;
  arg_01.field_2._M_allocated_capacity = (size_type)pcVar14;
  arg_01.field_2._8_8_ = pcVar15;
  TestArgsManager::SetNetworkOnlyArg(&test_args,arg_01);
  std::__cxx11::string::~string(local_5b0);
  ChainTypeToString_abi_cxx11_((string *)local_410,MAIN);
  ArgsManager::SelectConfigNetwork(&test_args.super_ArgsManager,(string *)local_410);
  std::__cxx11::string::~string((string *)local_410);
  local_1810 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1808 = "";
  local_1820 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1818 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_87.m_end = pvVar9;
  msg_87.m_begin = pvVar8;
  file_87.m_end = (iterator)0x24b;
  file_87.m_begin = (iterator)&local_1810;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_87,(size_t)&local_1820,
             msg_87);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_510,"-d",&local_1839);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_530,"xxx",&local_183a);
  ArgsManager::GetArg((string *)local_410,&test_args.super_ArgsManager,(string *)local_510,
                      &local_530);
  rVar5.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_410,"e");
  local_1838.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar5.super_readonly_property<bool>.super_class_property<bool>.value;
  local_1838.m_message.px = (element_type *)0x0;
  local_1838.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1850 = "test_args.GetArg(\"-d\", \"xxx\") == \"e\"";
  local_1848 = "";
  local_550._8_8_ = local_550._8_8_ & 0xffffffffffffff00;
  local_550._0_8_ = &PTR__lazy_ostream_0113a070;
  local_550._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1860 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1858 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_550._24_8_ = (allocator<char> *)&local_1850;
  boost::test_tools::tt_detail::report_assertion
            (&local_1838,(lazy_ostream *)local_550,1,0,WARN,(check_type)pcVar13,(size_t)&local_1860,
             0x24b);
  boost::detail::shared_count::~shared_count(&local_1838.m_message.pn);
  std::__cxx11::string::~string((string *)local_410);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)local_510);
  local_1870 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1868 = "";
  local_1880 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1878 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_88.m_end = pvVar9;
  msg_88.m_begin = pvVar8;
  file_88.m_end = (iterator)0x24c;
  file_88.m_begin = (iterator)&local_1870;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_88,(size_t)&local_1880,
             msg_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-ccc",(allocator<char> *)&local_1850);
  ArgsManager::GetArgs
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_550,&test_args.super_ArgsManager,(string *)local_410);
  local_530._M_string_length = 0;
  local_530.field_2._M_allocated_capacity = 0;
  local_1838._0_8_ = "test_args.GetArgs(\"-ccc\").size() == 2";
  local_1838.m_message.px = (element_type *)0xb53e5e;
  local_510._8_8_ = local_510._8_8_ & 0xffffffffffffff00;
  local_510._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_500._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1890 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1888 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_500._8_8_ = &local_1838;
  local_530._M_dataplus._M_p._0_1_ = local_550._8_8_ - local_550._0_8_ == 0x40;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_530,(lazy_ostream *)local_510,1,0,WARN,(check_type)pcVar13,
             (size_t)&local_1890,0x24c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_530.field_2._M_allocated_capacity);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_550);
  std::__cxx11::string::~string((string *)local_410);
  local_18a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1898 = "";
  local_18b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_18a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_89.m_end = pvVar9;
  msg_89.m_begin = pvVar8;
  file_89.m_end = (iterator)0x24d;
  file_89.m_begin = (iterator)&local_18a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_89,(size_t)&local_18b0,
             msg_89);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_510,"-h",&local_1839);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_530,"xxx",&local_183a);
  ArgsManager::GetArg((string *)local_410,&test_args.super_ArgsManager,(string *)local_510,
                      &local_530);
  rVar2.super_class_property<bool>.value =
       (class_property<bool>)
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_410,"0");
  local_1838.m_message.px = (element_type *)0x0;
  local_1838.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1850 = "test_args.GetArg(\"-h\", \"xxx\") == \"0\"";
  local_1848 = "";
  local_550._8_8_ = local_550._8_8_ & 0xffffffffffffff00;
  local_550._0_8_ = &PTR__lazy_ostream_0113a070;
  local_550._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_18c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_18b8 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_550._24_8_ = (allocator<char> *)&local_1850;
  local_1838.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar2.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_1838,(lazy_ostream *)local_550,1,0,WARN,(check_type)pcVar13,(size_t)&local_18c0,
             0x24d);
  boost::detail::shared_count::~shared_count(&local_1838.m_message.pn);
  std::__cxx11::string::~string((string *)local_410);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)local_510);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"sec1",(allocator<char> *)local_510);
  ArgsManager::SelectConfigNetwork(&test_args.super_ArgsManager,(string *)local_410);
  std::__cxx11::string::~string((string *)local_410);
  local_18d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_18c8 = "";
  local_18e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_18d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_90.m_end = pvVar9;
  msg_90.m_begin = pvVar8;
  file_90.m_end = (iterator)0x250;
  file_90.m_begin = (iterator)&local_18d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_90,(size_t)&local_18e0,
             msg_90);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_510,"-d",&local_1839);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_530,"xxx",&local_183a);
  ArgsManager::GetArg((string *)local_410,&test_args.super_ArgsManager,(string *)local_510,
                      &local_530);
  local_1838.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_410,"eee");
  local_1838.m_message.px = (element_type *)0x0;
  local_1838.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1850 = "test_args.GetArg(\"-d\", \"xxx\") == \"eee\"";
  local_1848 = "";
  local_550._8_8_ = local_550._8_8_ & 0xffffffffffffff00;
  local_550._0_8_ = &PTR__lazy_ostream_0113a070;
  local_550._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_18f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_18e8 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_550._24_8_ = (allocator<char> *)&local_1850;
  boost::test_tools::tt_detail::report_assertion
            (&local_1838,(lazy_ostream *)local_550,1,0,WARN,(check_type)pcVar13,(size_t)&local_18f0,
             0x250);
  boost::detail::shared_count::~shared_count(&local_1838.m_message.pn);
  std::__cxx11::string::~string((string *)local_410);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)local_510);
  local_1900 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_18f8 = "";
  local_1910 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1908 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_91.m_end = pvVar9;
  msg_91.m_begin = pvVar8;
  file_91.m_end = (iterator)0x251;
  file_91.m_begin = (iterator)&local_1900;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_91,(size_t)&local_1910,
             msg_91);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-d",(allocator<char> *)&local_1850);
  ArgsManager::GetArgs
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_550,&test_args.super_ArgsManager,(string *)local_410);
  local_530._M_dataplus._M_p._0_1_ = local_550._8_8_ - local_550._0_8_ == 0x20;
  local_530._M_string_length = 0;
  local_530.field_2._M_allocated_capacity = 0;
  local_1838._0_8_ = "test_args.GetArgs(\"-d\").size() == 1";
  local_1838.m_message.px = (element_type *)0xb53e82;
  local_510._8_8_ = local_510._8_8_ & 0xffffffffffffff00;
  local_510._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_500._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1920 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1918 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_500._8_8_ = &local_1838;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_530,(lazy_ostream *)local_510,1,0,WARN,(check_type)pcVar13,
             (size_t)&local_1920,0x251);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_530.field_2._M_allocated_capacity);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_550);
  std::__cxx11::string::~string((string *)local_410);
  local_1930 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1928 = "";
  local_1940 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1938 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_92.m_end = pvVar9;
  msg_92.m_begin = pvVar8;
  file_92.m_end = (iterator)0x252;
  file_92.m_begin = (iterator)&local_1930;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_92,(size_t)&local_1940,
             msg_92);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-ccc",(allocator<char> *)&local_1850);
  ArgsManager::GetArgs
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_550,&test_args.super_ArgsManager,(string *)local_410);
  local_530._M_dataplus._M_p._0_1_ = local_550._8_8_ - local_550._0_8_ == 0x40;
  local_530._M_string_length = 0;
  local_530.field_2._M_allocated_capacity = 0;
  local_1838._0_8_ = "test_args.GetArgs(\"-ccc\").size() == 2";
  local_1838.m_message.px = (element_type *)0xb53e5e;
  local_510._8_8_ = local_510._8_8_ & 0xffffffffffffff00;
  local_510._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_500._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1950 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1948 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_500._8_8_ = &local_1838;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_530,(lazy_ostream *)local_510,1,0,WARN,(check_type)pcVar13,
             (size_t)&local_1950,0x252);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_530.field_2._M_allocated_capacity);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_550);
  std::__cxx11::string::~string((string *)local_410);
  local_1960 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1958 = "";
  local_1970 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1968 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_93.m_end = pvVar9;
  msg_93.m_begin = pvVar8;
  file_93.m_end = (iterator)0x253;
  file_93.m_begin = (iterator)&local_1960;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_93,(size_t)&local_1970,
             msg_93);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_510,"-h",&local_1839);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_530,"xxx",&local_183a);
  ArgsManager::GetArg((string *)local_410,&test_args.super_ArgsManager,(string *)local_510,
                      &local_530);
  rVar2.super_class_property<bool>.value =
       (class_property<bool>)
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_410,"1");
  local_1838.m_message.px = (element_type *)0x0;
  local_1838.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1850 = "test_args.GetArg(\"-h\", \"xxx\") == \"1\"";
  local_1848 = "";
  local_550._8_8_ = local_550._8_8_ & 0xffffffffffffff00;
  local_550._0_8_ = &PTR__lazy_ostream_0113a070;
  local_550._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1980 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1978 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_550._24_8_ = (allocator<char> *)&local_1850;
  local_1838.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar2.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_1838,(lazy_ostream *)local_550,1,0,WARN,(check_type)pcVar13,(size_t)&local_1980,
             0x253);
  boost::detail::shared_count::~shared_count(&local_1838.m_message.pn);
  std::__cxx11::string::~string((string *)local_410);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)local_510);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"sec2",(allocator<char> *)local_510);
  ArgsManager::SelectConfigNetwork(&test_args.super_ArgsManager,(string *)local_410);
  std::__cxx11::string::~string((string *)local_410);
  local_1990 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1988 = "";
  local_19a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1998 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_94.m_end = pvVar9;
  msg_94.m_begin = pvVar8;
  file_94.m_end = (iterator)0x256;
  file_94.m_begin = (iterator)&local_1990;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_94,(size_t)&local_19a0,
             msg_94);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_510,"-d",&local_1839);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_530,"xxx",&local_183a);
  ArgsManager::GetArg((string *)local_410,&test_args.super_ArgsManager,(string *)local_510,
                      &local_530);
  local_1838.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_410,"xxx");
  local_1838.m_message.px = (element_type *)0x0;
  local_1838.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1850 = "test_args.GetArg(\"-d\", \"xxx\") == \"xxx\"";
  local_1848 = "";
  local_550._8_8_ = local_550._8_8_ & 0xffffffffffffff00;
  local_550._0_8_ = &PTR__lazy_ostream_0113a070;
  local_550._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_19b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_19a8 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_550._24_8_ = (allocator<char> *)&local_1850;
  boost::test_tools::tt_detail::report_assertion
            (&local_1838,(lazy_ostream *)local_550,1,0,WARN,(check_type)pcVar13,(size_t)&local_19b0,
             0x256);
  boost::detail::shared_count::~shared_count(&local_1838.m_message.pn);
  std::__cxx11::string::~string((string *)local_410);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)local_510);
  local_19c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_19b8 = "";
  local_19d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_19c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_95.m_end = pvVar9;
  msg_95.m_begin = pvVar8;
  file_95.m_end = (iterator)0x257;
  file_95.m_begin = (iterator)&local_19c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_95,(size_t)&local_19d0,
             msg_95);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-d",(allocator<char> *)&local_1850);
  ArgsManager::GetArgs
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_550,&test_args.super_ArgsManager,(string *)local_410);
  local_530._M_dataplus._M_p._0_1_ = local_550._8_8_ == local_550._0_8_;
  local_530._M_string_length = 0;
  local_530.field_2._M_allocated_capacity = 0;
  local_1838._0_8_ = "test_args.GetArgs(\"-d\").size() == 0";
  local_1838.m_message.px = (element_type *)0xb53ecd;
  local_510._8_8_ = local_510._8_8_ & 0xffffffffffffff00;
  local_510._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_500._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_19e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_19d8 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_500._8_8_ = &local_1838;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_530,(lazy_ostream *)local_510,1,0,WARN,(check_type)pcVar13,
             (size_t)&local_19e0,599);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_530.field_2._M_allocated_capacity);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_550);
  std::__cxx11::string::~string((string *)local_410);
  local_19f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_19e8 = "";
  local_1a00 = &boost::unit_test::basic_cstring<char_const>::null;
  local_19f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_96.m_end = pvVar9;
  msg_96.m_begin = pvVar8;
  file_96.m_end = (iterator)0x258;
  file_96.m_begin = (iterator)&local_19f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_96,(size_t)&local_1a00,
             msg_96);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_410,"-ccc",(allocator<char> *)&local_1850);
  ArgsManager::GetArgs
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_550,&test_args.super_ArgsManager,(string *)local_410);
  local_530._M_dataplus._M_p._0_1_ = local_550._8_8_ - local_550._0_8_ == 0x20;
  local_530._M_string_length = 0;
  local_530.field_2._M_allocated_capacity = 0;
  local_1838._0_8_ = "test_args.GetArgs(\"-ccc\").size() == 1";
  local_1838.m_message.px = (element_type *)0xb53ef3;
  local_510._8_8_ = local_510._8_8_ & 0xffffffffffffff00;
  local_510._0_8_ = &PTR__lazy_ostream_0113a070;
  aStack_500._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1a10 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1a08 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  aStack_500._8_8_ = &local_1838;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_530,(lazy_ostream *)local_510,1,0,WARN,(check_type)pcVar13,
             (size_t)&local_1a10,600);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_530.field_2._M_allocated_capacity);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_550);
  std::__cxx11::string::~string((string *)local_410);
  local_1a20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1a18 = "";
  local_1a30 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a28 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_97.m_end = pvVar9;
  msg_97.m_begin = pvVar8;
  file_97.m_end = (iterator)0x259;
  file_97.m_begin = (iterator)&local_1a20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_97,(size_t)&local_1a30,
             msg_97);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_510,"-h",&local_1839);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_530,"xxx",&local_183a);
  ArgsManager::GetArg((string *)local_410,&test_args.super_ArgsManager,(string *)local_510,
                      &local_530);
  rVar5.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_410,"0");
  local_1838.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar5.super_readonly_property<bool>.super_class_property<bool>.value;
  local_1838.m_message.px = (element_type *)0x0;
  local_1838.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1850 = "test_args.GetArg(\"-h\", \"xxx\") == \"0\"";
  local_1848 = "";
  local_550._8_8_ = local_550._8_8_ & 0xffffffffffffff00;
  local_550._0_8_ = &PTR__lazy_ostream_0113a070;
  local_550._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1a38 = "";
  local_550._24_8_ = (allocator<char> *)&local_1850;
  boost::test_tools::tt_detail::report_assertion
            (&local_1838,(lazy_ostream *)local_550,1,0,WARN,(check_type)pcVar13,(size_t)&local_1a40,
             0x259);
  boost::detail::shared_count::~shared_count(&local_1838.m_message.pn);
  std::__cxx11::string::~string((string *)local_410);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)local_510);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_17d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&sec2_ccc_expected);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_15c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&sec1_ccc_expected);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock16.super_unique_lock);
  ArgsManager::~ArgsManager(&test_args.super_ArgsManager);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_ReadConfigStream)
{
    const char *str_config =
       "a=\n"
       "b=1\n"
       "ccc=argument\n"
       "ccc=multiple\n"
       "d=e\n"
       "nofff=1\n"
       "noggg=0\n"
       "h=1\n"
       "noh=1\n"
       "noi=1\n"
       "i=1\n"
       "sec1.ccc=extend1\n"
       "\n"
       "[sec1]\n"
       "ccc=extend2\n"
       "d=eee\n"
       "h=1\n"
       "[sec2]\n"
       "ccc=extend3\n"
       "iii=2\n";

    TestArgsManager test_args;
    LOCK(test_args.cs_args);
    const auto a = std::make_pair("-a", ArgsManager::ALLOW_ANY);
    const auto b = std::make_pair("-b", ArgsManager::ALLOW_ANY);
    const auto ccc = std::make_pair("-ccc", ArgsManager::ALLOW_ANY);
    const auto d = std::make_pair("-d", ArgsManager::ALLOW_ANY);
    const auto e = std::make_pair("-e", ArgsManager::ALLOW_ANY);
    const auto fff = std::make_pair("-fff", ArgsManager::ALLOW_ANY);
    const auto ggg = std::make_pair("-ggg", ArgsManager::ALLOW_ANY);
    const auto h = std::make_pair("-h", ArgsManager::ALLOW_ANY);
    const auto i = std::make_pair("-i", ArgsManager::ALLOW_ANY);
    const auto iii = std::make_pair("-iii", ArgsManager::ALLOW_ANY);
    test_args.SetupArgs({a, b, ccc, d, e, fff, ggg, h, i, iii});

    test_args.ReadConfigString(str_config);
    // expectation: a, b, ccc, d, fff, ggg, h, i end up in map
    // so do sec1.ccc, sec1.d, sec1.h, sec2.ccc, sec2.iii

    BOOST_CHECK(test_args.m_settings.command_line_options.empty());
    BOOST_CHECK(test_args.m_settings.ro_config.size() == 3);
    BOOST_CHECK(test_args.m_settings.ro_config[""].size() == 8);
    BOOST_CHECK(test_args.m_settings.ro_config["sec1"].size() == 3);
    BOOST_CHECK(test_args.m_settings.ro_config["sec2"].size() == 2);

    BOOST_CHECK(test_args.m_settings.ro_config[""].count("a"));
    BOOST_CHECK(test_args.m_settings.ro_config[""].count("b"));
    BOOST_CHECK(test_args.m_settings.ro_config[""].count("ccc"));
    BOOST_CHECK(test_args.m_settings.ro_config[""].count("d"));
    BOOST_CHECK(test_args.m_settings.ro_config[""].count("fff"));
    BOOST_CHECK(test_args.m_settings.ro_config[""].count("ggg"));
    BOOST_CHECK(test_args.m_settings.ro_config[""].count("h"));
    BOOST_CHECK(test_args.m_settings.ro_config[""].count("i"));
    BOOST_CHECK(test_args.m_settings.ro_config["sec1"].count("ccc"));
    BOOST_CHECK(test_args.m_settings.ro_config["sec1"].count("h"));
    BOOST_CHECK(test_args.m_settings.ro_config["sec2"].count("ccc"));
    BOOST_CHECK(test_args.m_settings.ro_config["sec2"].count("iii"));

    BOOST_CHECK(test_args.IsArgSet("-a"));
    BOOST_CHECK(test_args.IsArgSet("-b"));
    BOOST_CHECK(test_args.IsArgSet("-ccc"));
    BOOST_CHECK(test_args.IsArgSet("-d"));
    BOOST_CHECK(test_args.IsArgSet("-fff"));
    BOOST_CHECK(test_args.IsArgSet("-ggg"));
    BOOST_CHECK(test_args.IsArgSet("-h"));
    BOOST_CHECK(test_args.IsArgSet("-i"));
    BOOST_CHECK(!test_args.IsArgSet("-zzz"));
    BOOST_CHECK(!test_args.IsArgSet("-iii"));

    BOOST_CHECK_EQUAL(test_args.GetArg("-a", "xxx"), "");
    BOOST_CHECK_EQUAL(test_args.GetArg("-b", "xxx"), "1");
    BOOST_CHECK_EQUAL(test_args.GetArg("-ccc", "xxx"), "argument");
    BOOST_CHECK_EQUAL(test_args.GetArg("-d", "xxx"), "e");
    BOOST_CHECK_EQUAL(test_args.GetArg("-fff", "xxx"), "0");
    BOOST_CHECK_EQUAL(test_args.GetArg("-ggg", "xxx"), "1");
    BOOST_CHECK_EQUAL(test_args.GetArg("-h", "xxx"), "0");
    BOOST_CHECK_EQUAL(test_args.GetArg("-i", "xxx"), "1");
    BOOST_CHECK_EQUAL(test_args.GetArg("-zzz", "xxx"), "xxx");
    BOOST_CHECK_EQUAL(test_args.GetArg("-iii", "xxx"), "xxx");

    for (const bool def : {false, true}) {
        BOOST_CHECK(test_args.GetBoolArg("-a", def));
        BOOST_CHECK(test_args.GetBoolArg("-b", def));
        BOOST_CHECK(!test_args.GetBoolArg("-ccc", def));
        BOOST_CHECK(!test_args.GetBoolArg("-d", def));
        BOOST_CHECK(!test_args.GetBoolArg("-fff", def));
        BOOST_CHECK(test_args.GetBoolArg("-ggg", def));
        BOOST_CHECK(!test_args.GetBoolArg("-h", def));
        BOOST_CHECK(test_args.GetBoolArg("-i", def));
        BOOST_CHECK(test_args.GetBoolArg("-zzz", def) == def);
        BOOST_CHECK(test_args.GetBoolArg("-iii", def) == def);
    }

    BOOST_CHECK(test_args.GetArgs("-a").size() == 1
                && test_args.GetArgs("-a").front() == "");
    BOOST_CHECK(test_args.GetArgs("-b").size() == 1
                && test_args.GetArgs("-b").front() == "1");
    BOOST_CHECK(test_args.GetArgs("-ccc").size() == 2
                && test_args.GetArgs("-ccc").front() == "argument"
                && test_args.GetArgs("-ccc").back() == "multiple");
    BOOST_CHECK(test_args.GetArgs("-fff").size() == 0);
    BOOST_CHECK(test_args.GetArgs("-nofff").size() == 0);
    BOOST_CHECK(test_args.GetArgs("-ggg").size() == 1
                && test_args.GetArgs("-ggg").front() == "1");
    BOOST_CHECK(test_args.GetArgs("-noggg").size() == 0);
    BOOST_CHECK(test_args.GetArgs("-h").size() == 0);
    BOOST_CHECK(test_args.GetArgs("-noh").size() == 0);
    BOOST_CHECK(test_args.GetArgs("-i").size() == 1
                && test_args.GetArgs("-i").front() == "1");
    BOOST_CHECK(test_args.GetArgs("-noi").size() == 0);
    BOOST_CHECK(test_args.GetArgs("-zzz").size() == 0);

    BOOST_CHECK(!test_args.IsArgNegated("-a"));
    BOOST_CHECK(!test_args.IsArgNegated("-b"));
    BOOST_CHECK(!test_args.IsArgNegated("-ccc"));
    BOOST_CHECK(!test_args.IsArgNegated("-d"));
    BOOST_CHECK(test_args.IsArgNegated("-fff"));
    BOOST_CHECK(!test_args.IsArgNegated("-ggg"));
    BOOST_CHECK(test_args.IsArgNegated("-h")); // last setting takes precedence
    BOOST_CHECK(!test_args.IsArgNegated("-i")); // last setting takes precedence
    BOOST_CHECK(!test_args.IsArgNegated("-zzz"));

    // Test sections work
    test_args.SelectConfigNetwork("sec1");

    // same as original
    BOOST_CHECK_EQUAL(test_args.GetArg("-a", "xxx"), "");
    BOOST_CHECK_EQUAL(test_args.GetArg("-b", "xxx"), "1");
    BOOST_CHECK_EQUAL(test_args.GetArg("-fff", "xxx"), "0");
    BOOST_CHECK_EQUAL(test_args.GetArg("-ggg", "xxx"), "1");
    BOOST_CHECK_EQUAL(test_args.GetArg("-zzz", "xxx"), "xxx");
    BOOST_CHECK_EQUAL(test_args.GetArg("-iii", "xxx"), "xxx");
    // d is overridden
    BOOST_CHECK(test_args.GetArg("-d", "xxx") == "eee");
    // section-specific setting
    BOOST_CHECK(test_args.GetArg("-h", "xxx") == "1");
    // section takes priority for multiple values
    BOOST_CHECK(test_args.GetArg("-ccc", "xxx") == "extend1");
    // check multiple values works
    const std::vector<std::string> sec1_ccc_expected = {"extend1","extend2","argument","multiple"};
    const auto& sec1_ccc_res = test_args.GetArgs("-ccc");
    BOOST_CHECK_EQUAL_COLLECTIONS(sec1_ccc_res.begin(), sec1_ccc_res.end(), sec1_ccc_expected.begin(), sec1_ccc_expected.end());

    test_args.SelectConfigNetwork("sec2");

    // same as original
    BOOST_CHECK(test_args.GetArg("-a", "xxx") == "");
    BOOST_CHECK(test_args.GetArg("-b", "xxx") == "1");
    BOOST_CHECK(test_args.GetArg("-d", "xxx") == "e");
    BOOST_CHECK(test_args.GetArg("-fff", "xxx") == "0");
    BOOST_CHECK(test_args.GetArg("-ggg", "xxx") == "1");
    BOOST_CHECK(test_args.GetArg("-zzz", "xxx") == "xxx");
    BOOST_CHECK(test_args.GetArg("-h", "xxx") == "0");
    // section-specific setting
    BOOST_CHECK(test_args.GetArg("-iii", "xxx") == "2");
    // section takes priority for multiple values
    BOOST_CHECK(test_args.GetArg("-ccc", "xxx") == "extend3");
    // check multiple values works
    const std::vector<std::string> sec2_ccc_expected = {"extend3","argument","multiple"};
    const auto& sec2_ccc_res = test_args.GetArgs("-ccc");
    BOOST_CHECK_EQUAL_COLLECTIONS(sec2_ccc_res.begin(), sec2_ccc_res.end(), sec2_ccc_expected.begin(), sec2_ccc_expected.end());

    // Test section only options

    test_args.SetNetworkOnlyArg("-d");
    test_args.SetNetworkOnlyArg("-ccc");
    test_args.SetNetworkOnlyArg("-h");

    test_args.SelectConfigNetwork(ChainTypeToString(ChainType::MAIN));
    BOOST_CHECK(test_args.GetArg("-d", "xxx") == "e");
    BOOST_CHECK(test_args.GetArgs("-ccc").size() == 2);
    BOOST_CHECK(test_args.GetArg("-h", "xxx") == "0");

    test_args.SelectConfigNetwork("sec1");
    BOOST_CHECK(test_args.GetArg("-d", "xxx") == "eee");
    BOOST_CHECK(test_args.GetArgs("-d").size() == 1);
    BOOST_CHECK(test_args.GetArgs("-ccc").size() == 2);
    BOOST_CHECK(test_args.GetArg("-h", "xxx") == "1");

    test_args.SelectConfigNetwork("sec2");
    BOOST_CHECK(test_args.GetArg("-d", "xxx") == "xxx");
    BOOST_CHECK(test_args.GetArgs("-d").size() == 0);
    BOOST_CHECK(test_args.GetArgs("-ccc").size() == 1);
    BOOST_CHECK(test_args.GetArg("-h", "xxx") == "0");
}